

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  int iVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  bool bVar89;
  bool bVar90;
  bool bVar91;
  bool bVar92;
  bool bVar93;
  bool bVar94;
  bool bVar95;
  bool bVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [28];
  uint uVar107;
  uint uVar108;
  uint uVar109;
  ulong uVar110;
  long lVar111;
  ulong uVar112;
  Geometry *pGVar113;
  ulong uVar114;
  undefined4 uVar115;
  float fVar131;
  undefined8 uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar156 [32];
  undefined1 auVar147 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar144;
  undefined1 auVar146 [16];
  float fVar145;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  float fVar181;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar208 [64];
  undefined4 uVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  float fVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar218;
  undefined1 in_ZMM12 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar229;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_804;
  Precalculations *local_800;
  RayQueryContext *local_7f8;
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [48];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_320 [32];
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar19 = prim[1];
  uVar114 = (ulong)(byte)PVar19;
  fVar145 = *(float *)(prim + uVar114 * 0x19 + 0x12);
  auVar22 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar114 * 0x19 + 6));
  auVar117._0_4_ = fVar145 * auVar22._0_4_;
  auVar117._4_4_ = fVar145 * auVar22._4_4_;
  auVar117._8_4_ = fVar145 * auVar22._8_4_;
  auVar117._12_4_ = fVar145 * auVar22._12_4_;
  auVar192._0_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar192._4_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar192._8_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar192._12_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar114 * 4 + 6);
  auVar159 = vpmovsxbd_avx2(auVar22);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar114 * 5 + 6);
  auVar25 = vpmovsxbd_avx2(auVar11);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar114 * 6 + 6);
  auVar178 = vpmovsxbd_avx2(auVar12);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar114 * 0xb + 6);
  auVar126 = vpmovsxbd_avx2(auVar13);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar19 * 0xc) + 6);
  auVar136 = vpmovsxbd_avx2(auVar14);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (uint)(byte)PVar19 * 0xc + uVar114 + 6);
  auVar26 = vpmovsxbd_avx2(auVar15);
  auVar26 = vcvtdq2ps_avx(auVar26);
  uVar110 = (ulong)(uint)((int)(uVar114 * 9) * 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar110 + 6);
  auVar128 = vpmovsxbd_avx2(auVar16);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar110 + uVar114 + 6);
  auVar27 = vpmovsxbd_avx2(auVar17);
  auVar27 = vcvtdq2ps_avx(auVar27);
  uVar110 = (ulong)(uint)((int)(uVar114 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar110 + 6);
  auVar28 = vpmovsxbd_avx2(auVar18);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar219._4_4_ = auVar192._0_4_;
  auVar219._0_4_ = auVar192._0_4_;
  auVar219._8_4_ = auVar192._0_4_;
  auVar219._12_4_ = auVar192._0_4_;
  auVar219._16_4_ = auVar192._0_4_;
  auVar219._20_4_ = auVar192._0_4_;
  auVar219._24_4_ = auVar192._0_4_;
  auVar219._28_4_ = auVar192._0_4_;
  auVar22 = vmovshdup_avx(auVar192);
  uVar116 = auVar22._0_8_;
  auVar230._8_8_ = uVar116;
  auVar230._0_8_ = uVar116;
  auVar230._16_8_ = uVar116;
  auVar230._24_8_ = uVar116;
  auVar22 = vshufps_avx(auVar192,auVar192,0xaa);
  fVar145 = auVar22._0_4_;
  auVar208._0_4_ = fVar145 * auVar178._0_4_;
  fVar131 = auVar22._4_4_;
  auVar208._4_4_ = fVar131 * auVar178._4_4_;
  auVar208._8_4_ = fVar145 * auVar178._8_4_;
  auVar208._12_4_ = fVar131 * auVar178._12_4_;
  auVar208._16_4_ = fVar145 * auVar178._16_4_;
  auVar208._20_4_ = fVar131 * auVar178._20_4_;
  auVar208._28_36_ = in_ZMM12._28_36_;
  auVar208._24_4_ = fVar145 * auVar178._24_4_;
  auVar205._0_4_ = auVar26._0_4_ * fVar145;
  auVar205._4_4_ = auVar26._4_4_ * fVar131;
  auVar205._8_4_ = auVar26._8_4_ * fVar145;
  auVar205._12_4_ = auVar26._12_4_ * fVar131;
  auVar205._16_4_ = auVar26._16_4_ * fVar145;
  auVar205._20_4_ = auVar26._20_4_ * fVar131;
  auVar205._28_36_ = in_ZMM10._28_36_;
  auVar205._24_4_ = auVar26._24_4_ * fVar145;
  auVar202._0_4_ = auVar28._0_4_ * fVar145;
  auVar202._4_4_ = auVar28._4_4_ * fVar131;
  auVar202._8_4_ = auVar28._8_4_ * fVar145;
  auVar202._12_4_ = auVar28._12_4_ * fVar131;
  auVar202._16_4_ = auVar28._16_4_ * fVar145;
  auVar202._20_4_ = auVar28._20_4_ * fVar131;
  auVar202._24_4_ = auVar28._24_4_ * fVar145;
  auVar202._28_4_ = 0;
  auVar22 = vfmadd231ps_fma(auVar208._0_32_,auVar230,auVar25);
  auVar11 = vfmadd231ps_fma(auVar205._0_32_,auVar230,auVar136);
  auVar12 = vfmadd231ps_fma(auVar202,auVar27,auVar230);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar219,auVar159);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar219,auVar126);
  auVar208 = ZEXT1664(auVar11);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar128,auVar219);
  auVar220._4_4_ = auVar117._0_4_;
  auVar220._0_4_ = auVar117._0_4_;
  auVar220._8_4_ = auVar117._0_4_;
  auVar220._12_4_ = auVar117._0_4_;
  auVar220._16_4_ = auVar117._0_4_;
  auVar220._20_4_ = auVar117._0_4_;
  auVar220._24_4_ = auVar117._0_4_;
  auVar220._28_4_ = auVar117._0_4_;
  auVar22 = vmovshdup_avx(auVar117);
  uVar116 = auVar22._0_8_;
  auVar231._8_8_ = uVar116;
  auVar231._0_8_ = uVar116;
  auVar231._16_8_ = uVar116;
  auVar231._24_8_ = uVar116;
  auVar22 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar145 = auVar22._0_4_;
  auVar195._0_4_ = fVar145 * auVar178._0_4_;
  fVar131 = auVar22._4_4_;
  auVar195._4_4_ = fVar131 * auVar178._4_4_;
  auVar195._8_4_ = fVar145 * auVar178._8_4_;
  auVar195._12_4_ = fVar131 * auVar178._12_4_;
  auVar195._16_4_ = fVar145 * auVar178._16_4_;
  auVar195._20_4_ = fVar131 * auVar178._20_4_;
  auVar195._24_4_ = fVar145 * auVar178._24_4_;
  auVar195._28_4_ = 0;
  auVar23._4_4_ = auVar26._4_4_ * fVar131;
  auVar23._0_4_ = auVar26._0_4_ * fVar145;
  auVar23._8_4_ = auVar26._8_4_ * fVar145;
  auVar23._12_4_ = auVar26._12_4_ * fVar131;
  auVar23._16_4_ = auVar26._16_4_ * fVar145;
  auVar23._20_4_ = auVar26._20_4_ * fVar131;
  auVar23._24_4_ = auVar26._24_4_ * fVar145;
  auVar23._28_4_ = auVar178._28_4_;
  auVar178._4_4_ = auVar28._4_4_ * fVar131;
  auVar178._0_4_ = auVar28._0_4_ * fVar145;
  auVar178._8_4_ = auVar28._8_4_ * fVar145;
  auVar178._12_4_ = auVar28._12_4_ * fVar131;
  auVar178._16_4_ = auVar28._16_4_ * fVar145;
  auVar178._20_4_ = auVar28._20_4_ * fVar131;
  auVar178._24_4_ = auVar28._24_4_ * fVar145;
  auVar178._28_4_ = fVar131;
  auVar22 = vfmadd231ps_fma(auVar195,auVar231,auVar25);
  auVar14 = vfmadd231ps_fma(auVar23,auVar231,auVar136);
  auVar15 = vfmadd231ps_fma(auVar178,auVar231,auVar27);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar220,auVar159);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar220,auVar126);
  local_1c0._8_4_ = 0x7fffffff;
  local_1c0._0_8_ = 0x7fffffff7fffffff;
  local_1c0._12_4_ = 0x7fffffff;
  local_1c0._16_4_ = 0x7fffffff;
  local_1c0._20_4_ = 0x7fffffff;
  local_1c0._24_4_ = 0x7fffffff;
  local_1c0._28_4_ = 0x7fffffff;
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar154._16_4_ = 0x219392ef;
  auVar154._20_4_ = 0x219392ef;
  auVar154._24_4_ = 0x219392ef;
  auVar154._28_4_ = 0x219392ef;
  auVar159 = vandps_avx(ZEXT1632(auVar13),local_1c0);
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar25 = vblendvps_avx(ZEXT1632(auVar13),auVar154,auVar159);
  auVar159 = vandps_avx(ZEXT1632(auVar11),local_1c0);
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar178 = vblendvps_avx(ZEXT1632(auVar11),auVar154,auVar159);
  auVar159 = vandps_avx(ZEXT1632(auVar12),local_1c0);
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar159 = vblendvps_avx(ZEXT1632(auVar12),auVar154,auVar159);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar220,auVar128);
  auVar126 = vrcpps_avx(auVar25);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = &DAT_3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar173._16_4_ = 0x3f800000;
  auVar173._20_4_ = 0x3f800000;
  auVar173._24_4_ = 0x3f800000;
  auVar173._28_4_ = 0x3f800000;
  auVar22 = vfnmadd213ps_fma(auVar25,auVar126,auVar173);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar126,auVar126);
  auVar25 = vrcpps_avx(auVar178);
  auVar11 = vfnmadd213ps_fma(auVar178,auVar25,auVar173);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar25,auVar25);
  auVar25 = vrcpps_avx(auVar159);
  auVar12 = vfnmadd213ps_fma(auVar159,auVar25,auVar173);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar25,auVar25);
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar114 * 7 + 6));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar16));
  auVar126._4_4_ = auVar22._4_4_ * auVar159._4_4_;
  auVar126._0_4_ = auVar22._0_4_ * auVar159._0_4_;
  auVar126._8_4_ = auVar22._8_4_ * auVar159._8_4_;
  auVar126._12_4_ = auVar22._12_4_ * auVar159._12_4_;
  auVar126._16_4_ = auVar159._16_4_ * 0.0;
  auVar126._20_4_ = auVar159._20_4_ * 0.0;
  auVar126._24_4_ = auVar159._24_4_ * 0.0;
  auVar126._28_4_ = auVar159._28_4_;
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar114 * 9 + 6));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar16));
  auVar136._4_4_ = auVar22._4_4_ * auVar159._4_4_;
  auVar136._0_4_ = auVar22._0_4_ * auVar159._0_4_;
  auVar136._8_4_ = auVar22._8_4_ * auVar159._8_4_;
  auVar136._12_4_ = auVar22._12_4_ * auVar159._12_4_;
  auVar136._16_4_ = auVar159._16_4_ * 0.0;
  auVar136._20_4_ = auVar159._20_4_ * 0.0;
  auVar136._24_4_ = auVar159._24_4_ * 0.0;
  auVar136._28_4_ = auVar159._28_4_;
  auVar119._1_3_ = 0;
  auVar119[0] = PVar19;
  auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar19 * 0x10 + 6));
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar19 * 0x10 + uVar114 * -2 + 6));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar14));
  auVar26._4_4_ = auVar159._4_4_ * auVar11._4_4_;
  auVar26._0_4_ = auVar159._0_4_ * auVar11._0_4_;
  auVar26._8_4_ = auVar159._8_4_ * auVar11._8_4_;
  auVar26._12_4_ = auVar159._12_4_ * auVar11._12_4_;
  auVar26._16_4_ = auVar159._16_4_ * 0.0;
  auVar26._20_4_ = auVar159._20_4_ * 0.0;
  auVar26._24_4_ = auVar159._24_4_ * 0.0;
  auVar26._28_4_ = auVar159._28_4_;
  auVar159 = vcvtdq2ps_avx(auVar25);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar14));
  auVar128._4_4_ = auVar11._4_4_ * auVar159._4_4_;
  auVar128._0_4_ = auVar11._0_4_ * auVar159._0_4_;
  auVar128._8_4_ = auVar11._8_4_ * auVar159._8_4_;
  auVar128._12_4_ = auVar11._12_4_ * auVar159._12_4_;
  auVar128._16_4_ = auVar159._16_4_ * 0.0;
  auVar128._20_4_ = auVar159._20_4_ * 0.0;
  auVar128._24_4_ = auVar159._24_4_ * 0.0;
  auVar128._28_4_ = auVar159._28_4_;
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 + uVar114 + 6));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar13));
  auVar27._4_4_ = auVar159._4_4_ * auVar12._4_4_;
  auVar27._0_4_ = auVar159._0_4_ * auVar12._0_4_;
  auVar27._8_4_ = auVar159._8_4_ * auVar12._8_4_;
  auVar27._12_4_ = auVar159._12_4_ * auVar12._12_4_;
  auVar27._16_4_ = auVar159._16_4_ * 0.0;
  auVar27._20_4_ = auVar159._20_4_ * 0.0;
  auVar27._24_4_ = auVar159._24_4_ * 0.0;
  auVar27._28_4_ = auVar159._28_4_;
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar114 * 0x17 + 6));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,ZEXT1632(auVar13));
  auVar28._4_4_ = auVar12._4_4_ * auVar159._4_4_;
  auVar28._0_4_ = auVar12._0_4_ * auVar159._0_4_;
  auVar28._8_4_ = auVar12._8_4_ * auVar159._8_4_;
  auVar28._12_4_ = auVar12._12_4_ * auVar159._12_4_;
  auVar28._16_4_ = auVar159._16_4_ * 0.0;
  auVar28._20_4_ = auVar159._20_4_ * 0.0;
  auVar28._24_4_ = auVar159._24_4_ * 0.0;
  auVar28._28_4_ = auVar159._28_4_;
  auVar159 = vpminsd_avx2(auVar126,auVar136);
  auVar25 = vpminsd_avx2(auVar26,auVar128);
  auVar159 = vmaxps_avx(auVar159,auVar25);
  uVar115 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar196._4_4_ = uVar115;
  auVar196._0_4_ = uVar115;
  auVar196._8_4_ = uVar115;
  auVar196._12_4_ = uVar115;
  auVar196._16_4_ = uVar115;
  auVar196._20_4_ = uVar115;
  auVar196._24_4_ = uVar115;
  auVar196._28_4_ = uVar115;
  auVar25 = vpminsd_avx2(auVar27,auVar28);
  auVar25 = vmaxps_avx(auVar25,auVar196);
  auVar205 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar159 = vmaxps_avx(auVar159,auVar25);
  local_80._4_4_ = auVar159._4_4_ * 0.99999964;
  local_80._0_4_ = auVar159._0_4_ * 0.99999964;
  local_80._8_4_ = auVar159._8_4_ * 0.99999964;
  local_80._12_4_ = auVar159._12_4_ * 0.99999964;
  local_80._16_4_ = auVar159._16_4_ * 0.99999964;
  local_80._20_4_ = auVar159._20_4_ * 0.99999964;
  local_80._24_4_ = auVar159._24_4_ * 0.99999964;
  local_80._28_4_ = auVar25._28_4_;
  auVar159 = vpmaxsd_avx2(auVar126,auVar136);
  auVar25 = vpmaxsd_avx2(auVar26,auVar128);
  auVar159 = vminps_avx(auVar159,auVar25);
  auVar25 = vpmaxsd_avx2(auVar27,auVar28);
  fVar145 = (ray->super_RayK<1>).tfar;
  auVar155._4_4_ = fVar145;
  auVar155._0_4_ = fVar145;
  auVar155._8_4_ = fVar145;
  auVar155._12_4_ = fVar145;
  auVar155._16_4_ = fVar145;
  auVar155._20_4_ = fVar145;
  auVar155._24_4_ = fVar145;
  auVar155._28_4_ = fVar145;
  auVar25 = vminps_avx(auVar25,auVar155);
  auVar159 = vminps_avx(auVar159,auVar25);
  auVar24._4_4_ = auVar159._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar159._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar159._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar159._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar159._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar159._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar159._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar159._28_4_;
  auVar119[4] = PVar19;
  auVar119._5_3_ = 0;
  auVar119[8] = PVar19;
  auVar119._9_3_ = 0;
  auVar119[0xc] = PVar19;
  auVar119._13_3_ = 0;
  auVar119[0x10] = PVar19;
  auVar119._17_3_ = 0;
  auVar119[0x14] = PVar19;
  auVar119._21_3_ = 0;
  auVar119[0x18] = PVar19;
  auVar119._25_3_ = 0;
  auVar119[0x1c] = PVar19;
  auVar119._29_3_ = 0;
  auVar25 = vpcmpgtd_avx2(auVar119,_DAT_0205a920);
  auVar159 = vcmpps_avx(local_80,auVar24,2);
  auVar159 = vandps_avx(auVar159,auVar25);
  uVar107 = vmovmskps_avx(auVar159);
  if (uVar107 != 0) {
    uVar107 = uVar107 & 0xff;
    local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_1d0 = 0x7fffffff;
    uStack_1cc = 0x7fffffff;
    uStack_1c8 = 0x7fffffff;
    uStack_1c4 = 0x7fffffff;
    do {
      auVar159 = local_400;
      local_720 = auVar205._0_32_;
      local_6a0 = auVar208._0_32_;
      lVar29 = 0;
      uVar114 = (ulong)uVar107;
      for (uVar110 = uVar114; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar107 = *(uint *)(prim + 2);
      uVar109 = *(uint *)(prim + lVar29 * 4 + 6);
      local_7e8 = (ulong)uVar107;
      pGVar113 = (context->scene->geometries).items[uVar107].ptr;
      local_788 = (ulong)uVar109;
      uVar110 = (ulong)*(uint *)(*(long *)&pGVar113->field_0x58 +
                                pGVar113[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar109);
      p_Var21 = pGVar113[1].intersectionFilterN;
      lVar29 = *(long *)&pGVar113[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar29 + (long)p_Var21 * uVar110);
      local_760 = *(undefined8 *)*pauVar1;
      uStack_758 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar29 + (uVar110 + 1) * (long)p_Var21);
      local_630 = *(undefined8 *)*pauVar2;
      uStack_628 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar29 + (uVar110 + 2) * (long)p_Var21);
      local_640 = *(undefined8 *)*pauVar3;
      uStack_638 = *(undefined8 *)(*pauVar3 + 8);
      uVar114 = uVar114 - 1 & uVar114;
      pauVar4 = (undefined1 (*) [16])(lVar29 + (uVar110 + 3) * (long)p_Var21);
      local_340 = *(undefined8 *)*pauVar4;
      uStack_338 = *(undefined8 *)(*pauVar4 + 8);
      local_650 = (float)local_340;
      fStack_64c = (float)((ulong)local_340 >> 0x20);
      fStack_648 = (float)uStack_338;
      fStack_644 = (float)((ulong)uStack_338 >> 0x20);
      if (uVar114 != 0) {
        uVar112 = uVar114 - 1 & uVar114;
        for (uVar110 = uVar114; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
        }
        if (uVar112 != 0) {
          for (; (uVar112 & 1) == 0; uVar112 = uVar112 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar20 = (int)pGVar113[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->super_RayK<1>).org.field_0;
      auVar11 = vsubps_avx(*pauVar1,(undefined1  [16])aVar8);
      uVar115 = auVar11._0_4_;
      auVar167._4_4_ = uVar115;
      auVar167._0_4_ = uVar115;
      auVar167._8_4_ = uVar115;
      auVar167._12_4_ = uVar115;
      auVar22 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar9 = (pre->ray_space).vx.field_0;
      aVar10 = (pre->ray_space).vy.field_0;
      fVar145 = (pre->ray_space).vz.field_0.m128[0];
      fVar131 = (pre->ray_space).vz.field_0.m128[1];
      fVar233 = (pre->ray_space).vz.field_0.m128[2];
      fVar234 = (pre->ray_space).vz.field_0.m128[3];
      auVar185._0_4_ = auVar11._0_4_ * fVar145;
      auVar185._4_4_ = auVar11._4_4_ * fVar131;
      auVar185._8_4_ = auVar11._8_4_ * fVar233;
      auVar185._12_4_ = auVar11._12_4_ * fVar234;
      auVar22 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar10,auVar22);
      auVar15 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar9,auVar167);
      auVar22 = vblendps_avx(auVar15,*pauVar1,8);
      auVar12 = vsubps_avx(*pauVar2,(undefined1  [16])aVar8);
      uVar115 = auVar12._0_4_;
      auVar186._4_4_ = uVar115;
      auVar186._0_4_ = uVar115;
      auVar186._8_4_ = uVar115;
      auVar186._12_4_ = uVar115;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar206._0_4_ = auVar12._0_4_ * fVar145;
      auVar206._4_4_ = auVar12._4_4_ * fVar131;
      auVar206._8_4_ = auVar12._8_4_ * fVar233;
      auVar206._12_4_ = auVar12._12_4_ * fVar234;
      auVar11 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar10,auVar11);
      auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar9,auVar186);
      auVar11 = vblendps_avx(auVar16,*pauVar2,8);
      auVar13 = vsubps_avx(*pauVar3,(undefined1  [16])aVar8);
      uVar115 = auVar13._0_4_;
      auVar193._4_4_ = uVar115;
      auVar193._0_4_ = uVar115;
      auVar193._8_4_ = uVar115;
      auVar193._12_4_ = uVar115;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar210._0_4_ = auVar13._0_4_ * fVar145;
      auVar210._4_4_ = auVar13._4_4_ * fVar131;
      auVar210._8_4_ = auVar13._8_4_ * fVar233;
      auVar210._12_4_ = auVar13._12_4_ * fVar234;
      auVar12 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar10,auVar12);
      auVar17 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar9,auVar193);
      auVar12 = vblendps_avx(auVar17,*pauVar3,8);
      auVar30._12_4_ = fStack_644;
      auVar30._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar14 = vsubps_avx(auVar30,(undefined1  [16])aVar8);
      uVar115 = auVar14._0_4_;
      auVar194._4_4_ = uVar115;
      auVar194._0_4_ = uVar115;
      auVar194._8_4_ = uVar115;
      auVar194._12_4_ = uVar115;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar213._0_4_ = auVar14._0_4_ * fVar145;
      auVar213._4_4_ = auVar14._4_4_ * fVar131;
      auVar213._8_4_ = auVar14._8_4_ * fVar233;
      auVar213._12_4_ = auVar14._12_4_ * fVar234;
      auVar13 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar10,auVar13);
      auVar18 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar9,auVar194);
      auVar13 = vblendps_avx(auVar18,auVar30,8);
      auVar32._4_4_ = uStack_1cc;
      auVar32._0_4_ = local_1d0;
      auVar32._8_4_ = uStack_1c8;
      auVar32._12_4_ = uStack_1c4;
      auVar22 = vandps_avx(auVar22,auVar32);
      auVar11 = vandps_avx(auVar11,auVar32);
      auVar14 = vmaxps_avx(auVar22,auVar11);
      auVar22 = vandps_avx(auVar12,auVar32);
      auVar11 = vandps_avx(auVar13,auVar32);
      auVar22 = vmaxps_avx(auVar22,auVar11);
      auVar22 = vmaxps_avx(auVar14,auVar22);
      auVar11 = vmovshdup_avx(auVar22);
      auVar11 = vmaxss_avx(auVar11,auVar22);
      auVar22 = vshufpd_avx(auVar22,auVar22,1);
      auVar22 = vmaxss_avx(auVar22,auVar11);
      lVar29 = (long)iVar20 * 0x44;
      auVar11 = vmovshdup_avx(auVar15);
      uVar116 = auVar11._0_8_;
      local_4e0._8_8_ = uVar116;
      local_4e0._0_8_ = uVar116;
      local_4e0._16_8_ = uVar116;
      local_4e0._24_8_ = uVar116;
      auVar25 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x484);
      auVar11 = vmovshdup_avx(auVar16);
      uVar116 = auVar11._0_8_;
      local_540._8_8_ = uVar116;
      local_540._0_8_ = uVar116;
      local_540._16_8_ = uVar116;
      local_540._24_8_ = uVar116;
      auVar178 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x908);
      uVar209 = auVar17._0_4_;
      local_6c0._4_4_ = uVar209;
      local_6c0._0_4_ = uVar209;
      local_6c0._8_4_ = uVar209;
      local_6c0._12_4_ = uVar209;
      local_6c0._16_4_ = uVar209;
      local_6c0._20_4_ = uVar209;
      local_6c0._24_4_ = uVar209;
      local_6c0._28_4_ = uVar209;
      auVar11 = vmovshdup_avx(auVar17);
      uVar116 = auVar11._0_8_;
      local_6e0._8_8_ = uVar116;
      local_6e0._0_8_ = uVar116;
      local_6e0._16_8_ = uVar116;
      local_6e0._24_8_ = uVar116;
      fVar131 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar29 + 0xd8c);
      fVar233 = *(float *)(bezier_basis0 + lVar29 + 0xd90);
      fVar234 = *(float *)(bezier_basis0 + lVar29 + 0xd94);
      fVar235 = *(float *)(bezier_basis0 + lVar29 + 0xd98);
      fVar236 = *(float *)(bezier_basis0 + lVar29 + 0xd9c);
      fVar144 = *(float *)(bezier_basis0 + lVar29 + 0xda0);
      fVar179 = *(float *)(bezier_basis0 + lVar29 + 0xda4);
      auVar106 = *(undefined1 (*) [28])(bezier_basis0 + lVar29 + 0xd8c);
      local_600 = auVar18._0_4_;
      auVar11 = vmovshdup_avx(auVar18);
      local_700 = auVar11._0_8_;
      auVar187._0_4_ = fVar131 * local_600;
      auVar187._4_4_ = fVar233 * local_600;
      auVar187._8_4_ = fVar234 * local_600;
      auVar187._12_4_ = fVar235 * local_600;
      auVar187._16_4_ = fVar236 * local_600;
      auVar187._20_4_ = fVar144 * local_600;
      auVar187._24_4_ = fVar179 * local_600;
      auVar187._28_4_ = 0;
      fVar229 = auVar11._0_4_;
      auVar118._0_4_ = fVar229 * fVar131;
      fVar232 = auVar11._4_4_;
      auVar118._4_4_ = fVar232 * fVar233;
      auVar118._8_4_ = fVar229 * fVar234;
      auVar118._12_4_ = fVar232 * fVar235;
      auVar118._16_4_ = fVar229 * fVar236;
      auVar118._20_4_ = fVar232 * fVar144;
      auVar118._24_4_ = fVar229 * fVar179;
      auVar118._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar187,auVar178,local_6c0);
      auVar12 = vfmadd231ps_fma(auVar118,auVar178,local_6e0);
      uVar115 = auVar16._0_4_;
      local_620._4_4_ = uVar115;
      local_620._0_4_ = uVar115;
      local_620._8_4_ = uVar115;
      local_620._12_4_ = uVar115;
      local_620._16_4_ = uVar115;
      local_620._20_4_ = uVar115;
      local_620._24_4_ = uVar115;
      local_620._28_4_ = uVar115;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,local_620);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar25,local_540);
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar29);
      uVar115 = auVar15._0_4_;
      local_5e0._4_4_ = uVar115;
      local_5e0._0_4_ = uVar115;
      local_5e0._8_4_ = uVar115;
      local_5e0._12_4_ = uVar115;
      local_5e0._16_4_ = uVar115;
      local_5e0._20_4_ = uVar115;
      local_5e0._24_4_ = uVar115;
      local_5e0._28_4_ = uVar115;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,local_5e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_4e0);
      auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x908);
      fVar180 = *(float *)(bezier_basis1 + lVar29 + 0xd8c);
      fVar181 = *(float *)(bezier_basis1 + lVar29 + 0xd90);
      fVar182 = *(float *)(bezier_basis1 + lVar29 + 0xd94);
      fVar183 = *(float *)(bezier_basis1 + lVar29 + 0xd98);
      fVar184 = *(float *)(bezier_basis1 + lVar29 + 0xd9c);
      fVar97 = *(float *)(bezier_basis1 + lVar29 + 0xda0);
      fVar98 = *(float *)(bezier_basis1 + lVar29 + 0xda4);
      fStack_5fc = local_600;
      fStack_5f8 = local_600;
      fStack_5f4 = local_600;
      fStack_5f0 = local_600;
      fStack_5ec = local_600;
      fStack_5e8 = local_600;
      fStack_5e4 = local_600;
      auVar33._4_4_ = fVar181 * local_600;
      auVar33._0_4_ = fVar180 * local_600;
      auVar33._8_4_ = fVar182 * local_600;
      auVar33._12_4_ = fVar183 * local_600;
      auVar33._16_4_ = fVar184 * local_600;
      auVar33._20_4_ = fVar97 * local_600;
      auVar33._24_4_ = fVar98 * local_600;
      auVar33._28_4_ = local_600;
      auVar13 = vfmadd231ps_fma(auVar33,auVar136,local_6c0);
      uStack_6f8 = local_700;
      uStack_6f0 = local_700;
      uStack_6e8 = local_700;
      auVar34._4_4_ = fVar232 * fVar181;
      auVar34._0_4_ = fVar229 * fVar180;
      auVar34._8_4_ = fVar229 * fVar182;
      auVar34._12_4_ = fVar232 * fVar183;
      auVar34._16_4_ = fVar229 * fVar184;
      auVar34._20_4_ = fVar232 * fVar97;
      auVar34._24_4_ = fVar229 * fVar98;
      auVar34._28_4_ = uVar209;
      auVar14 = vfmadd231ps_fma(auVar34,auVar136,local_6e0);
      auVar26 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,local_620);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,local_540);
      auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar29);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar128,local_5e0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar128,local_4e0);
      local_200 = ZEXT1632(auVar13);
      local_240 = ZEXT1632(auVar11);
      auVar28 = vsubps_avx(local_200,local_240);
      local_220 = ZEXT1632(auVar14);
      auVar119 = ZEXT1632(auVar12);
      auVar23 = vsubps_avx(local_220,auVar119);
      auVar120._0_4_ = auVar12._0_4_ * auVar28._0_4_;
      auVar120._4_4_ = auVar12._4_4_ * auVar28._4_4_;
      auVar120._8_4_ = auVar12._8_4_ * auVar28._8_4_;
      auVar120._12_4_ = auVar12._12_4_ * auVar28._12_4_;
      auVar120._16_4_ = auVar28._16_4_ * 0.0;
      auVar120._20_4_ = auVar28._20_4_ * 0.0;
      auVar120._24_4_ = auVar28._24_4_ * 0.0;
      auVar120._28_4_ = 0;
      fVar212 = auVar23._0_4_;
      auVar132._0_4_ = fVar212 * auVar11._0_4_;
      fVar218 = auVar23._4_4_;
      auVar132._4_4_ = fVar218 * auVar11._4_4_;
      fVar224 = auVar23._8_4_;
      auVar132._8_4_ = fVar224 * auVar11._8_4_;
      fVar225 = auVar23._12_4_;
      auVar132._12_4_ = fVar225 * auVar11._12_4_;
      fVar226 = auVar23._16_4_;
      auVar132._16_4_ = fVar226 * 0.0;
      fVar227 = auVar23._20_4_;
      auVar132._20_4_ = fVar227 * 0.0;
      fVar228 = auVar23._24_4_;
      auVar132._24_4_ = fVar228 * 0.0;
      auVar132._28_4_ = 0;
      auVar24 = vsubps_avx(auVar120,auVar132);
      auVar11 = vpermilps_avx(*pauVar1,0xff);
      uVar116 = auVar11._0_8_;
      local_a0._8_8_ = uVar116;
      local_a0._0_8_ = uVar116;
      local_a0._16_8_ = uVar116;
      local_a0._24_8_ = uVar116;
      auVar12 = vpermilps_avx(*pauVar2,0xff);
      uVar116 = auVar12._0_8_;
      local_c0._8_8_ = uVar116;
      local_c0._0_8_ = uVar116;
      local_c0._16_8_ = uVar116;
      local_c0._24_8_ = uVar116;
      auVar12 = vpermilps_avx(*pauVar3,0xff);
      uVar116 = auVar12._0_8_;
      local_e0._8_8_ = uVar116;
      local_e0._0_8_ = uVar116;
      local_e0._16_8_ = uVar116;
      local_e0._24_8_ = uVar116;
      auVar31._12_4_ = fStack_644;
      auVar31._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar12 = vpermilps_avx(auVar31,0xff);
      local_100 = auVar12._0_8_;
      fVar145 = auVar12._0_4_;
      auVar188._0_4_ = fVar131 * fVar145;
      fVar131 = auVar12._4_4_;
      auVar188._4_4_ = fVar233 * fVar131;
      auVar188._8_4_ = fVar234 * fVar145;
      auVar188._12_4_ = fVar235 * fVar131;
      auVar188._16_4_ = fVar236 * fVar145;
      auVar188._20_4_ = fVar144 * fVar131;
      auVar188._24_4_ = fVar179 * fVar145;
      auVar188._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar188,local_e0,auVar178);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_c0,auVar25);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar35._4_4_ = fVar181 * fVar131;
      auVar35._0_4_ = fVar180 * fVar145;
      auVar35._8_4_ = fVar182 * fVar145;
      auVar35._12_4_ = fVar183 * fVar131;
      auVar35._16_4_ = fVar184 * fVar145;
      auVar35._20_4_ = fVar97 * fVar131;
      auVar35._24_4_ = fVar98 * fVar145;
      auVar35._28_4_ = auVar126._28_4_;
      auVar12 = vfmadd231ps_fma(auVar35,auVar136,local_e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar26,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar128,local_a0);
      auVar36._4_4_ = fVar218 * fVar218;
      auVar36._0_4_ = fVar212 * fVar212;
      auVar36._8_4_ = fVar224 * fVar224;
      auVar36._12_4_ = fVar225 * fVar225;
      auVar36._16_4_ = fVar226 * fVar226;
      auVar36._20_4_ = fVar227 * fVar227;
      auVar36._24_4_ = fVar228 * fVar228;
      auVar36._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar36,auVar28,auVar28);
      auVar27 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar37._4_4_ = auVar27._4_4_ * auVar27._4_4_ * auVar11._4_4_;
      auVar37._0_4_ = auVar27._0_4_ * auVar27._0_4_ * auVar11._0_4_;
      auVar37._8_4_ = auVar27._8_4_ * auVar27._8_4_ * auVar11._8_4_;
      auVar37._12_4_ = auVar27._12_4_ * auVar27._12_4_ * auVar11._12_4_;
      auVar37._16_4_ = auVar27._16_4_ * auVar27._16_4_ * 0.0;
      auVar37._20_4_ = auVar27._20_4_ * auVar27._20_4_ * 0.0;
      auVar37._24_4_ = auVar27._24_4_ * auVar27._24_4_ * 0.0;
      auVar37._28_4_ = auVar27._28_4_;
      auVar38._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar38._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar38._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar38._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar38._16_4_ = auVar24._16_4_ * auVar24._16_4_;
      auVar38._20_4_ = auVar24._20_4_ * auVar24._20_4_;
      auVar38._24_4_ = auVar24._24_4_ * auVar24._24_4_;
      auVar38._28_4_ = auVar24._28_4_;
      auVar27 = vcmpps_avx(auVar38,auVar37,2);
      auVar161 = ZEXT3264(auVar27);
      fVar145 = auVar22._0_4_ * 4.7683716e-07;
      _local_780 = ZEXT416((uint)fVar145);
      auVar121._0_4_ = (float)iVar20;
      local_400._4_12_ = auVar17._4_12_;
      local_400._0_4_ = auVar121._0_4_;
      local_400._16_16_ = auVar159._16_16_;
      auVar121._4_4_ = auVar121._0_4_;
      auVar121._8_4_ = auVar121._0_4_;
      auVar121._12_4_ = auVar121._0_4_;
      auVar121._16_4_ = auVar121._0_4_;
      auVar121._20_4_ = auVar121._0_4_;
      auVar121._24_4_ = auVar121._0_4_;
      auVar121._28_4_ = auVar121._0_4_;
      auVar159 = vcmpps_avx(_DAT_02020f40,auVar121,1);
      auVar11 = vpermilps_avx(auVar15,0xaa);
      uVar116 = auVar11._0_8_;
      local_460._8_8_ = uVar116;
      local_460._0_8_ = uVar116;
      local_460._16_8_ = uVar116;
      local_460._24_8_ = uVar116;
      auVar12 = vpermilps_avx(auVar16,0xaa);
      uVar116 = auVar12._0_8_;
      local_440._8_8_ = uVar116;
      local_440._0_8_ = uVar116;
      local_440._16_8_ = uVar116;
      local_440._24_8_ = uVar116;
      auVar22 = vshufps_avx(auVar17,auVar17,0xaa);
      uVar116 = auVar22._0_8_;
      local_1a0._8_8_ = uVar116;
      local_1a0._0_8_ = uVar116;
      local_1a0._16_8_ = uVar116;
      local_1a0._24_8_ = uVar116;
      auVar22 = vshufps_avx(auVar18,auVar18,0xaa);
      uVar116 = auVar22._0_8_;
      register0x00001508 = uVar116;
      local_520 = uVar116;
      register0x00001510 = uVar116;
      register0x00001518 = uVar116;
      auVar216 = ZEXT3264(_local_520);
      auVar24 = auVar159 & auVar27;
      uVar7 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      _local_560 = ZEXT416(uVar7);
      fVar131 = fVar229;
      fVar233 = fVar232;
      fVar234 = fVar229;
      fVar235 = fVar232;
      fVar236 = fVar229;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        auVar208 = ZEXT3264(local_6a0);
        auVar205 = ZEXT3264(local_720);
        auVar143 = ZEXT3264(local_540);
        auVar211 = ZEXT3264(local_6c0);
        auVar223 = ZEXT3264(local_6e0);
        auVar197 = ZEXT3264(CONCAT428(local_600,
                                      CONCAT424(local_600,
                                                CONCAT420(local_600,
                                                          CONCAT416(local_600,
                                                                    CONCAT412(local_600,
                                                                              CONCAT48(local_600,
                                                                                       CONCAT44(
                                                  local_600,local_600))))))));
        auVar201 = ZEXT3264(local_620);
        auVar191 = ZEXT3264(local_5e0);
      }
      else {
        local_260 = vandps_avx(auVar27,auVar159);
        fVar212 = auVar22._0_4_;
        fVar218 = auVar22._4_4_;
        auVar159._4_4_ = fVar218 * fVar181;
        auVar159._0_4_ = fVar212 * fVar180;
        auVar159._8_4_ = fVar212 * fVar182;
        auVar159._12_4_ = fVar218 * fVar183;
        auVar159._16_4_ = fVar212 * fVar184;
        auVar159._20_4_ = fVar218 * fVar97;
        auVar159._24_4_ = fVar212 * fVar98;
        auVar159._28_4_ = local_260._28_4_;
        auVar22 = vfmadd213ps_fma(auVar136,local_1a0,auVar159);
        auVar22 = vfmadd213ps_fma(auVar26,local_440,ZEXT1632(auVar22));
        auVar22 = vfmadd213ps_fma(auVar128,local_460,ZEXT1632(auVar22));
        local_480._0_4_ = auVar106._0_4_;
        local_480._4_4_ = auVar106._4_4_;
        fStack_478 = auVar106._8_4_;
        fStack_474 = auVar106._12_4_;
        fStack_470 = auVar106._16_4_;
        fStack_46c = auVar106._20_4_;
        fStack_468 = auVar106._24_4_;
        auVar122._0_4_ = fVar212 * (float)local_480._0_4_;
        auVar122._4_4_ = fVar218 * (float)local_480._4_4_;
        auVar122._8_4_ = fVar212 * fStack_478;
        auVar122._12_4_ = fVar218 * fStack_474;
        auVar122._16_4_ = fVar212 * fStack_470;
        auVar122._20_4_ = fVar218 * fStack_46c;
        auVar122._24_4_ = fVar212 * fStack_468;
        auVar122._28_4_ = 0;
        auVar15 = vfmadd213ps_fma(auVar178,local_1a0,auVar122);
        auVar15 = vfmadd213ps_fma(auVar25,local_440,ZEXT1632(auVar15));
        auVar159 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1210);
        auVar25 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1694);
        auVar178 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1b18);
        fVar144 = *(float *)(bezier_basis0 + lVar29 + 0x1f9c);
        fVar179 = *(float *)(bezier_basis0 + lVar29 + 0x1fa0);
        fVar180 = *(float *)(bezier_basis0 + lVar29 + 0x1fa4);
        fVar181 = *(float *)(bezier_basis0 + lVar29 + 0x1fa8);
        fVar182 = *(float *)(bezier_basis0 + lVar29 + 0x1fac);
        fVar183 = *(float *)(bezier_basis0 + lVar29 + 0x1fb0);
        fVar184 = *(float *)(bezier_basis0 + lVar29 + 0x1fb4);
        auVar174._0_4_ = local_600 * fVar144;
        auVar174._4_4_ = local_600 * fVar179;
        auVar174._8_4_ = local_600 * fVar180;
        auVar174._12_4_ = local_600 * fVar181;
        auVar174._16_4_ = local_600 * fVar182;
        auVar174._20_4_ = local_600 * fVar183;
        auVar174._24_4_ = local_600 * fVar184;
        auVar174._28_4_ = 0;
        auVar39._4_4_ = fVar232 * fVar179;
        auVar39._0_4_ = fVar229 * fVar144;
        auVar39._8_4_ = fVar229 * fVar180;
        auVar39._12_4_ = fVar232 * fVar181;
        auVar39._16_4_ = fVar229 * fVar182;
        auVar39._20_4_ = fVar232 * fVar183;
        auVar39._24_4_ = fVar229 * fVar184;
        auVar39._28_4_ = auVar12._4_4_;
        auVar40._4_4_ = fVar218 * fVar179;
        auVar40._0_4_ = fVar212 * fVar144;
        auVar40._8_4_ = fVar212 * fVar180;
        auVar40._12_4_ = fVar218 * fVar181;
        auVar40._16_4_ = fVar212 * fVar182;
        auVar40._20_4_ = fVar218 * fVar183;
        auVar40._24_4_ = fVar212 * fVar184;
        auVar40._28_4_ = fVar218;
        auVar12 = vfmadd231ps_fma(auVar174,auVar178,local_6c0);
        auVar16 = vfmadd231ps_fma(auVar39,auVar178,local_6e0);
        auVar17 = vfmadd231ps_fma(auVar40,local_1a0,auVar178);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar25,local_620);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar25,local_540);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar25,local_440);
        _local_480 = auVar23;
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar159,local_5e0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar159,local_4e0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_460,auVar159);
        fVar144 = *(float *)(bezier_basis1 + lVar29 + 0x1f9c);
        fVar179 = *(float *)(bezier_basis1 + lVar29 + 0x1fa0);
        fVar180 = *(float *)(bezier_basis1 + lVar29 + 0x1fa4);
        fVar181 = *(float *)(bezier_basis1 + lVar29 + 0x1fa8);
        fVar182 = *(float *)(bezier_basis1 + lVar29 + 0x1fac);
        fVar183 = *(float *)(bezier_basis1 + lVar29 + 0x1fb0);
        fVar184 = *(float *)(bezier_basis1 + lVar29 + 0x1fb4);
        auVar25._4_4_ = local_600 * fVar179;
        auVar25._0_4_ = local_600 * fVar144;
        auVar25._8_4_ = local_600 * fVar180;
        auVar25._12_4_ = local_600 * fVar181;
        auVar25._16_4_ = local_600 * fVar182;
        auVar25._20_4_ = local_600 * fVar183;
        auVar25._24_4_ = local_600 * fVar184;
        auVar25._28_4_ = auVar159._28_4_;
        auVar41._4_4_ = fVar232 * fVar179;
        auVar41._0_4_ = fVar229 * fVar144;
        auVar41._8_4_ = fVar229 * fVar180;
        auVar41._12_4_ = fVar232 * fVar181;
        auVar41._16_4_ = fVar229 * fVar182;
        auVar41._20_4_ = fVar232 * fVar183;
        auVar41._24_4_ = fVar229 * fVar184;
        auVar41._28_4_ = fVar232;
        auVar42._4_4_ = fVar179 * fVar218;
        auVar42._0_4_ = fVar144 * fVar212;
        auVar42._8_4_ = fVar180 * fVar212;
        auVar42._12_4_ = fVar181 * fVar218;
        auVar42._16_4_ = fVar182 * fVar212;
        auVar42._20_4_ = fVar183 * fVar218;
        auVar42._24_4_ = fVar184 * fVar212;
        auVar42._28_4_ = auVar11._4_4_;
        auVar159 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1b18);
        auVar11 = vfmadd231ps_fma(auVar25,auVar159,local_6c0);
        auVar18 = vfmadd231ps_fma(auVar41,auVar159,local_6e0);
        auVar117 = vfmadd231ps_fma(auVar42,auVar159,local_1a0);
        auVar159 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1694);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar159,local_620);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar159,local_540);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_440,auVar159);
        auVar159 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1210);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar159,local_5e0);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar159,local_4e0);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_460,auVar159);
        auVar159 = vandps_avx(local_1c0,ZEXT1632(auVar12));
        auVar25 = vandps_avx(ZEXT1632(auVar16),local_1c0);
        auVar25 = vmaxps_avx(auVar159,auVar25);
        auVar159 = vandps_avx(ZEXT1632(auVar17),local_1c0);
        auVar159 = vmaxps_avx(auVar25,auVar159);
        auVar133._4_4_ = fVar145;
        auVar133._0_4_ = fVar145;
        auVar133._8_4_ = fVar145;
        auVar133._12_4_ = fVar145;
        auVar133._16_4_ = fVar145;
        auVar133._20_4_ = fVar145;
        auVar133._24_4_ = fVar145;
        auVar133._28_4_ = fVar145;
        auVar159 = vcmpps_avx(auVar159,auVar133,1);
        auVar178 = vblendvps_avx(ZEXT1632(auVar12),auVar28,auVar159);
        auVar136 = vblendvps_avx(ZEXT1632(auVar16),auVar23,auVar159);
        auVar159 = vandps_avx(ZEXT1632(auVar11),local_1c0);
        auVar25 = vandps_avx(ZEXT1632(auVar18),local_1c0);
        auVar25 = vmaxps_avx(auVar159,auVar25);
        auVar159 = vandps_avx(ZEXT1632(auVar117),local_1c0);
        auVar159 = vmaxps_avx(auVar25,auVar159);
        auVar25 = vcmpps_avx(auVar159,auVar133,1);
        auVar159 = vblendvps_avx(ZEXT1632(auVar11),auVar28,auVar25);
        auVar25 = vblendvps_avx(ZEXT1632(auVar18),auVar23,auVar25);
        auVar11 = vfmadd213ps_fma(auVar126,local_460,ZEXT1632(auVar15));
        auVar12 = vfmadd213ps_fma(auVar178,auVar178,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar136,auVar136);
        auVar126 = vrsqrtps_avx(ZEXT1632(auVar12));
        fVar144 = auVar126._0_4_;
        fVar179 = auVar126._4_4_;
        fVar180 = auVar126._8_4_;
        fVar181 = auVar126._12_4_;
        fVar182 = auVar126._16_4_;
        fVar183 = auVar126._20_4_;
        fVar184 = auVar126._24_4_;
        auVar43._4_4_ = fVar179 * fVar179 * fVar179 * auVar12._4_4_ * -0.5;
        auVar43._0_4_ = fVar144 * fVar144 * fVar144 * auVar12._0_4_ * -0.5;
        auVar43._8_4_ = fVar180 * fVar180 * fVar180 * auVar12._8_4_ * -0.5;
        auVar43._12_4_ = fVar181 * fVar181 * fVar181 * auVar12._12_4_ * -0.5;
        auVar43._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar43._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar43._24_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar43._28_4_ = 0;
        auVar221._8_4_ = 0x3fc00000;
        auVar221._0_8_ = 0x3fc000003fc00000;
        auVar221._12_4_ = 0x3fc00000;
        auVar221._16_4_ = 0x3fc00000;
        auVar221._20_4_ = 0x3fc00000;
        auVar221._24_4_ = 0x3fc00000;
        auVar221._28_4_ = 0x3fc00000;
        auVar12 = vfmadd231ps_fma(auVar43,auVar221,auVar126);
        fVar144 = auVar12._0_4_;
        fVar179 = auVar12._4_4_;
        auVar44._4_4_ = auVar136._4_4_ * fVar179;
        auVar44._0_4_ = auVar136._0_4_ * fVar144;
        fVar180 = auVar12._8_4_;
        auVar44._8_4_ = auVar136._8_4_ * fVar180;
        fVar181 = auVar12._12_4_;
        auVar44._12_4_ = auVar136._12_4_ * fVar181;
        auVar44._16_4_ = auVar136._16_4_ * 0.0;
        auVar44._20_4_ = auVar136._20_4_ * 0.0;
        auVar44._24_4_ = auVar136._24_4_ * 0.0;
        auVar44._28_4_ = auVar126._28_4_;
        auVar45._4_4_ = -auVar178._4_4_ * fVar179;
        auVar45._0_4_ = -auVar178._0_4_ * fVar144;
        auVar45._8_4_ = -auVar178._8_4_ * fVar180;
        auVar45._12_4_ = -auVar178._12_4_ * fVar181;
        auVar45._16_4_ = -auVar178._16_4_ * 0.0;
        auVar45._20_4_ = -auVar178._20_4_ * 0.0;
        auVar45._24_4_ = -auVar178._24_4_ * 0.0;
        auVar45._28_4_ = auVar178._28_4_ ^ 0x80000000;
        auVar12 = vfmadd213ps_fma(auVar159,auVar159,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar25,auVar25);
        auVar178 = vrsqrtps_avx(ZEXT1632(auVar12));
        auVar126 = ZEXT1632(CONCAT412(fVar181 * 0.0,
                                      CONCAT48(fVar180 * 0.0,CONCAT44(fVar179 * 0.0,fVar144 * 0.0)))
                           );
        fVar144 = auVar178._0_4_;
        fVar179 = auVar178._4_4_;
        fVar180 = auVar178._8_4_;
        fVar181 = auVar178._12_4_;
        fVar182 = auVar178._16_4_;
        fVar183 = auVar178._20_4_;
        fVar184 = auVar178._24_4_;
        auVar46._4_4_ = fVar179 * fVar179 * auVar12._4_4_ * -0.5 * fVar179;
        auVar46._0_4_ = fVar144 * fVar144 * auVar12._0_4_ * -0.5 * fVar144;
        auVar46._8_4_ = fVar180 * fVar180 * auVar12._8_4_ * -0.5 * fVar180;
        auVar46._12_4_ = fVar181 * fVar181 * auVar12._12_4_ * -0.5 * fVar181;
        auVar46._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar46._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar46._24_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar46._28_4_ = 0xbf000000;
        auVar12 = vfmadd231ps_fma(auVar46,auVar221,auVar178);
        fVar144 = auVar12._0_4_;
        fVar179 = auVar12._4_4_;
        auVar47._4_4_ = fVar179 * auVar25._4_4_;
        auVar47._0_4_ = fVar144 * auVar25._0_4_;
        fVar180 = auVar12._8_4_;
        auVar47._8_4_ = fVar180 * auVar25._8_4_;
        fVar181 = auVar12._12_4_;
        auVar47._12_4_ = fVar181 * auVar25._12_4_;
        auVar47._16_4_ = auVar25._16_4_ * 0.0;
        auVar47._20_4_ = auVar25._20_4_ * 0.0;
        auVar47._24_4_ = auVar25._24_4_ * 0.0;
        auVar47._28_4_ = 0;
        auVar48._4_4_ = fVar179 * -auVar159._4_4_;
        auVar48._0_4_ = fVar144 * -auVar159._0_4_;
        auVar48._8_4_ = fVar180 * -auVar159._8_4_;
        auVar48._12_4_ = fVar181 * -auVar159._12_4_;
        auVar48._16_4_ = -auVar159._16_4_ * 0.0;
        auVar48._20_4_ = -auVar159._20_4_ * 0.0;
        auVar48._24_4_ = -auVar159._24_4_ * 0.0;
        auVar48._28_4_ = 0;
        auVar49._28_4_ = auVar178._28_4_;
        auVar49._0_28_ =
             ZEXT1628(CONCAT412(fVar181 * 0.0,
                                CONCAT48(fVar180 * 0.0,CONCAT44(fVar179 * 0.0,fVar144 * 0.0))));
        auVar12 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar13),local_240);
        auVar159 = ZEXT1632(auVar13);
        auVar15 = vfmadd213ps_fma(auVar45,auVar159,auVar119);
        auVar16 = vfmadd213ps_fma(auVar126,auVar159,ZEXT1632(auVar11));
        auVar117 = vfnmadd213ps_fma(auVar44,auVar159,local_240);
        auVar17 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar14),local_200);
        auVar192 = vfnmadd213ps_fma(auVar45,auVar159,auVar119);
        auVar159 = ZEXT1632(auVar14);
        auVar18 = vfmadd213ps_fma(auVar48,auVar159,local_220);
        local_580 = ZEXT1632(auVar13);
        auVar32 = vfnmadd231ps_fma(ZEXT1632(auVar11),local_580,auVar126);
        auVar11 = vfmadd213ps_fma(auVar49,auVar159,ZEXT1632(auVar22));
        auVar30 = vfnmadd213ps_fma(auVar47,auVar159,local_200);
        auVar31 = vfnmadd213ps_fma(auVar48,auVar159,local_220);
        _local_500 = ZEXT1632(auVar14);
        auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar22),_local_500,auVar49);
        auVar159 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar192));
        auVar25 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar32));
        auVar156._0_4_ = auVar32._0_4_ * auVar159._0_4_;
        auVar156._4_4_ = auVar32._4_4_ * auVar159._4_4_;
        auVar156._8_4_ = auVar32._8_4_ * auVar159._8_4_;
        auVar156._12_4_ = auVar32._12_4_ * auVar159._12_4_;
        auVar156._16_4_ = auVar159._16_4_ * 0.0;
        auVar156._20_4_ = auVar159._20_4_ * 0.0;
        auVar156._24_4_ = auVar159._24_4_ * 0.0;
        auVar156._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar156,ZEXT1632(auVar192),auVar25);
        auVar50._4_4_ = auVar25._4_4_ * auVar117._4_4_;
        auVar50._0_4_ = auVar25._0_4_ * auVar117._0_4_;
        auVar50._8_4_ = auVar25._8_4_ * auVar117._8_4_;
        auVar50._12_4_ = auVar25._12_4_ * auVar117._12_4_;
        auVar50._16_4_ = auVar25._16_4_ * 0.0;
        auVar50._20_4_ = auVar25._20_4_ * 0.0;
        auVar50._24_4_ = auVar25._24_4_ * 0.0;
        auVar50._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar117));
        auVar22 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar32),auVar25);
        auVar51._4_4_ = auVar192._4_4_ * auVar25._4_4_;
        auVar51._0_4_ = auVar192._0_4_ * auVar25._0_4_;
        auVar51._8_4_ = auVar192._8_4_ * auVar25._8_4_;
        auVar51._12_4_ = auVar192._12_4_ * auVar25._12_4_;
        auVar51._16_4_ = auVar25._16_4_ * 0.0;
        auVar51._20_4_ = auVar25._20_4_ * 0.0;
        auVar51._24_4_ = auVar25._24_4_ * 0.0;
        auVar51._28_4_ = auVar25._28_4_;
        auVar136 = ZEXT1632(auVar117);
        auVar14 = vfmsub231ps_fma(auVar51,auVar136,auVar159);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar27 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,2);
        local_7e0 = vblendvps_avx(ZEXT1632(auVar30),ZEXT1632(auVar12),auVar27);
        auVar159 = vblendvps_avx(ZEXT1632(auVar31),ZEXT1632(auVar15),auVar27);
        local_680._0_32_ = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar16),auVar27);
        auVar25 = vblendvps_avx(auVar136,ZEXT1632(auVar17),auVar27);
        auVar178 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar18),auVar27);
        auVar126 = vblendvps_avx(ZEXT1632(auVar32),ZEXT1632(auVar11),auVar27);
        auVar136 = vblendvps_avx(ZEXT1632(auVar17),auVar136,auVar27);
        auVar26 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar192),auVar27);
        auVar22 = vpackssdw_avx(local_260._0_16_,local_260._16_16_);
        local_7c0 = ZEXT1632(auVar22);
        auVar128 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar32),auVar27);
        auVar28 = vsubps_avx(auVar136,local_7e0);
        auVar23 = vsubps_avx(auVar26,auVar159);
        auVar24 = vsubps_avx(auVar128,local_680._0_32_);
        auVar119 = vsubps_avx(local_7e0,auVar25);
        auVar154 = vsubps_avx(auVar159,auVar178);
        auVar155 = vsubps_avx(local_680._0_32_,auVar126);
        auVar52._4_4_ = auVar24._4_4_ * local_7e0._4_4_;
        auVar52._0_4_ = auVar24._0_4_ * local_7e0._0_4_;
        auVar52._8_4_ = auVar24._8_4_ * local_7e0._8_4_;
        auVar52._12_4_ = auVar24._12_4_ * local_7e0._12_4_;
        auVar52._16_4_ = auVar24._16_4_ * local_7e0._16_4_;
        auVar52._20_4_ = auVar24._20_4_ * local_7e0._20_4_;
        auVar52._24_4_ = auVar24._24_4_ * local_7e0._24_4_;
        auVar52._28_4_ = auVar128._28_4_;
        auVar11 = vfmsub231ps_fma(auVar52,local_680._0_32_,auVar28);
        auVar53._4_4_ = auVar159._4_4_ * auVar28._4_4_;
        auVar53._0_4_ = auVar159._0_4_ * auVar28._0_4_;
        auVar53._8_4_ = auVar159._8_4_ * auVar28._8_4_;
        auVar53._12_4_ = auVar159._12_4_ * auVar28._12_4_;
        auVar53._16_4_ = auVar159._16_4_ * auVar28._16_4_;
        auVar53._20_4_ = auVar159._20_4_ * auVar28._20_4_;
        auVar53._24_4_ = auVar159._24_4_ * auVar28._24_4_;
        auVar53._28_4_ = auVar136._28_4_;
        auVar12 = vfmsub231ps_fma(auVar53,local_7e0,auVar23);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar123._0_4_ = auVar23._0_4_ * local_680._0_4_;
        auVar123._4_4_ = auVar23._4_4_ * local_680._4_4_;
        auVar123._8_4_ = auVar23._8_4_ * local_680._8_4_;
        auVar123._12_4_ = auVar23._12_4_ * local_680._12_4_;
        auVar123._16_4_ = auVar23._16_4_ * local_680._16_4_;
        auVar123._20_4_ = auVar23._20_4_ * local_680._20_4_;
        auVar123._24_4_ = auVar23._24_4_ * local_680._24_4_;
        auVar123._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar123,auVar159,auVar24);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar161 = ZEXT1664(auVar12);
        auVar124._0_4_ = auVar155._0_4_ * auVar25._0_4_;
        auVar124._4_4_ = auVar155._4_4_ * auVar25._4_4_;
        auVar124._8_4_ = auVar155._8_4_ * auVar25._8_4_;
        auVar124._12_4_ = auVar155._12_4_ * auVar25._12_4_;
        auVar124._16_4_ = auVar155._16_4_ * auVar25._16_4_;
        auVar124._20_4_ = auVar155._20_4_ * auVar25._20_4_;
        auVar124._24_4_ = auVar155._24_4_ * auVar25._24_4_;
        auVar124._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar124,auVar119,auVar126);
        auVar54._4_4_ = auVar154._4_4_ * auVar126._4_4_;
        auVar54._0_4_ = auVar154._0_4_ * auVar126._0_4_;
        auVar54._8_4_ = auVar154._8_4_ * auVar126._8_4_;
        auVar54._12_4_ = auVar154._12_4_ * auVar126._12_4_;
        auVar54._16_4_ = auVar154._16_4_ * auVar126._16_4_;
        auVar54._20_4_ = auVar154._20_4_ * auVar126._20_4_;
        auVar54._24_4_ = auVar154._24_4_ * auVar126._24_4_;
        auVar54._28_4_ = auVar126._28_4_;
        auVar13 = vfmsub231ps_fma(auVar54,auVar178,auVar155);
        auVar55._4_4_ = auVar119._4_4_ * auVar178._4_4_;
        auVar55._0_4_ = auVar119._0_4_ * auVar178._0_4_;
        auVar55._8_4_ = auVar119._8_4_ * auVar178._8_4_;
        auVar55._12_4_ = auVar119._12_4_ * auVar178._12_4_;
        auVar55._16_4_ = auVar119._16_4_ * auVar178._16_4_;
        auVar55._20_4_ = auVar119._20_4_ * auVar178._20_4_;
        auVar55._24_4_ = auVar119._24_4_ * auVar178._24_4_;
        auVar55._28_4_ = auVar26._28_4_;
        auVar14 = vfmsub231ps_fma(auVar55,auVar154,auVar25);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar25 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
        auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar22 = vpand_avx(auVar11,auVar22);
        auVar25 = vpmovsxwd_avx2(auVar22);
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) {
LAB_018ce7ec:
          auVar191 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar208 = ZEXT3264(local_6a0);
          auVar205 = ZEXT3264(local_720);
        }
        else {
          auVar56._4_4_ = auVar23._4_4_ * auVar155._4_4_;
          auVar56._0_4_ = auVar23._0_4_ * auVar155._0_4_;
          auVar56._8_4_ = auVar23._8_4_ * auVar155._8_4_;
          auVar56._12_4_ = auVar23._12_4_ * auVar155._12_4_;
          auVar56._16_4_ = auVar23._16_4_ * auVar155._16_4_;
          auVar56._20_4_ = auVar23._20_4_ * auVar155._20_4_;
          auVar56._24_4_ = auVar23._24_4_ * auVar155._24_4_;
          auVar56._28_4_ = auVar25._28_4_;
          auVar16 = vfmsub231ps_fma(auVar56,auVar154,auVar24);
          auVar134._0_4_ = auVar24._0_4_ * auVar119._0_4_;
          auVar134._4_4_ = auVar24._4_4_ * auVar119._4_4_;
          auVar134._8_4_ = auVar24._8_4_ * auVar119._8_4_;
          auVar134._12_4_ = auVar24._12_4_ * auVar119._12_4_;
          auVar134._16_4_ = auVar24._16_4_ * auVar119._16_4_;
          auVar134._20_4_ = auVar24._20_4_ * auVar119._20_4_;
          auVar134._24_4_ = auVar24._24_4_ * auVar119._24_4_;
          auVar134._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar134,auVar28,auVar155);
          auVar57._4_4_ = auVar154._4_4_ * auVar28._4_4_;
          auVar57._0_4_ = auVar154._0_4_ * auVar28._0_4_;
          auVar57._8_4_ = auVar154._8_4_ * auVar28._8_4_;
          auVar57._12_4_ = auVar154._12_4_ * auVar28._12_4_;
          auVar57._16_4_ = auVar154._16_4_ * auVar28._16_4_;
          auVar57._20_4_ = auVar154._20_4_ * auVar28._20_4_;
          auVar57._24_4_ = auVar154._24_4_ * auVar28._24_4_;
          auVar57._28_4_ = auVar178._28_4_;
          auVar17 = vfmsub231ps_fma(auVar57,auVar119,auVar23);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar15),ZEXT1632(auVar17));
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),_DAT_02020f00);
          auVar25 = vrcpps_avx(ZEXT1632(auVar14));
          auVar207._8_4_ = 0x3f800000;
          auVar207._0_8_ = &DAT_3f8000003f800000;
          auVar207._12_4_ = 0x3f800000;
          auVar207._16_4_ = 0x3f800000;
          auVar207._20_4_ = 0x3f800000;
          auVar207._24_4_ = 0x3f800000;
          auVar207._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar25,ZEXT1632(auVar14),auVar207);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar25,auVar25);
          auVar189._0_4_ = auVar17._0_4_ * local_680._0_4_;
          auVar189._4_4_ = auVar17._4_4_ * local_680._4_4_;
          auVar189._8_4_ = auVar17._8_4_ * local_680._8_4_;
          auVar189._12_4_ = auVar17._12_4_ * local_680._12_4_;
          auVar189._16_4_ = local_680._16_4_ * 0.0;
          auVar189._20_4_ = local_680._20_4_ * 0.0;
          auVar189._24_4_ = local_680._24_4_ * 0.0;
          auVar189._28_4_ = 0;
          auVar15 = vfmadd231ps_fma(auVar189,auVar159,ZEXT1632(auVar15));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar16),local_7e0);
          fVar179 = auVar11._0_4_;
          fVar180 = auVar11._4_4_;
          fVar181 = auVar11._8_4_;
          fVar182 = auVar11._12_4_;
          auVar178 = ZEXT1632(CONCAT412(fVar182 * auVar15._12_4_,
                                        CONCAT48(fVar181 * auVar15._8_4_,
                                                 CONCAT44(fVar180 * auVar15._4_4_,
                                                          fVar179 * auVar15._0_4_))));
          auVar125._4_4_ = uVar7;
          auVar125._0_4_ = uVar7;
          auVar125._8_4_ = uVar7;
          auVar125._12_4_ = uVar7;
          auVar125._16_4_ = uVar7;
          auVar125._20_4_ = uVar7;
          auVar125._24_4_ = uVar7;
          auVar125._28_4_ = uVar7;
          fVar144 = (ray->super_RayK<1>).tfar;
          auVar135._4_4_ = fVar144;
          auVar135._0_4_ = fVar144;
          auVar135._8_4_ = fVar144;
          auVar135._12_4_ = fVar144;
          auVar135._16_4_ = fVar144;
          auVar135._20_4_ = fVar144;
          auVar135._24_4_ = fVar144;
          auVar135._28_4_ = fVar144;
          auVar159 = vcmpps_avx(auVar125,auVar178,2);
          auVar25 = vcmpps_avx(auVar178,auVar135,2);
          auVar159 = vandps_avx(auVar25,auVar159);
          auVar11 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
          auVar22 = vpand_avx(auVar22,auVar11);
          auVar159 = vpmovsxwd_avx2(auVar22);
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0x7f,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0xbf,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar159[0x1f]) goto LAB_018ce7ec;
          auVar159 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,4);
          auVar11 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
          auVar22 = vpand_avx(auVar22,auVar11);
          auVar159 = vpmovsxwd_avx2(auVar22);
          auVar191 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar208 = ZEXT3264(local_6a0);
          auVar205 = ZEXT3264(local_720);
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar159 >> 0x7f,0) != '\0') ||
                (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0xbf,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar159[0x1f] < '\0') {
            auVar126 = ZEXT1632(CONCAT412(fVar182 * auVar12._12_4_,
                                          CONCAT48(fVar181 * auVar12._8_4_,
                                                   CONCAT44(fVar180 * auVar12._4_4_,
                                                            fVar179 * auVar12._0_4_))));
            auVar136 = ZEXT1632(CONCAT412(fVar182 * auVar13._12_4_,
                                          CONCAT48(fVar181 * auVar13._8_4_,
                                                   CONCAT44(fVar180 * auVar13._4_4_,
                                                            fVar179 * auVar13._0_4_))));
            auVar168._8_4_ = 0x3f800000;
            auVar168._0_8_ = &DAT_3f8000003f800000;
            auVar168._12_4_ = 0x3f800000;
            auVar168._16_4_ = 0x3f800000;
            auVar168._20_4_ = 0x3f800000;
            auVar168._24_4_ = 0x3f800000;
            auVar168._28_4_ = 0x3f800000;
            auVar25 = vsubps_avx(auVar168,auVar126);
            auVar161 = ZEXT3264(auVar25);
            auVar25 = vblendvps_avx(auVar25,auVar126,auVar27);
            auVar208 = ZEXT3264(auVar25);
            auVar25 = vsubps_avx(auVar168,auVar136);
            local_280 = vblendvps_avx(auVar25,auVar136,auVar27);
            auVar191 = ZEXT3264(auVar159);
            auVar205 = ZEXT3264(auVar178);
          }
        }
        auVar223 = ZEXT3264(local_6e0);
        auVar216 = ZEXT3264(_local_520);
        auVar211 = ZEXT3264(local_6c0);
        auVar159 = auVar191._0_32_;
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar159 >> 0xbf,0) == '\0') &&
            (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar191[0x1f]) {
          auVar143 = ZEXT3264(local_540);
          auVar197 = ZEXT3264(CONCAT428(local_600,
                                        CONCAT424(local_600,
                                                  CONCAT420(local_600,
                                                            CONCAT416(local_600,
                                                                      CONCAT412(local_600,
                                                                                CONCAT48(local_600,
                                                                                         CONCAT44(
                                                  local_600,local_600))))))));
          auVar201 = ZEXT3264(local_620);
          auVar191 = ZEXT3264(local_5e0);
        }
        else {
          auVar25 = vsubps_avx(_local_500,local_580);
          local_3e0 = auVar208._0_32_;
          auVar22 = vfmadd213ps_fma(auVar25,local_3e0,local_580);
          fVar144 = pre->depth_scale;
          auVar58._4_4_ = (auVar22._4_4_ + auVar22._4_4_) * fVar144;
          auVar58._0_4_ = (auVar22._0_4_ + auVar22._0_4_) * fVar144;
          auVar58._8_4_ = (auVar22._8_4_ + auVar22._8_4_) * fVar144;
          auVar58._12_4_ = (auVar22._12_4_ + auVar22._12_4_) * fVar144;
          auVar58._16_4_ = fVar144 * 0.0;
          auVar58._20_4_ = fVar144 * 0.0;
          auVar58._24_4_ = fVar144 * 0.0;
          auVar58._28_4_ = 0;
          local_3a0 = auVar205._0_32_;
          auVar25 = vcmpps_avx(local_3a0,auVar58,6);
          auVar178 = auVar159 & auVar25;
          auVar197 = ZEXT3264(CONCAT428(local_600,
                                        CONCAT424(local_600,
                                                  CONCAT420(local_600,
                                                            CONCAT416(local_600,
                                                                      CONCAT412(local_600,
                                                                                CONCAT48(local_600,
                                                                                         CONCAT44(
                                                  local_600,local_600))))))));
          auVar201 = ZEXT3264(local_620);
          auVar191 = ZEXT3264(local_5e0);
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            auVar159 = vandps_avx(auVar25,auVar159);
            auVar137._8_4_ = 0xbf800000;
            auVar137._0_8_ = 0xbf800000bf800000;
            auVar137._12_4_ = 0xbf800000;
            auVar137._16_4_ = 0xbf800000;
            auVar137._20_4_ = 0xbf800000;
            auVar137._24_4_ = 0xbf800000;
            auVar137._28_4_ = 0xbf800000;
            auVar157._8_4_ = 0x40000000;
            auVar157._0_8_ = 0x4000000040000000;
            auVar157._12_4_ = 0x40000000;
            auVar157._16_4_ = 0x40000000;
            auVar157._20_4_ = 0x40000000;
            auVar157._24_4_ = 0x40000000;
            auVar157._28_4_ = 0x40000000;
            auVar161 = ZEXT3264(auVar157);
            auVar22 = vfmadd213ps_fma(local_280,auVar157,auVar137);
            local_280 = ZEXT1632(auVar22);
            auVar25 = local_280;
            local_3c0 = ZEXT1632(auVar22);
            local_380 = 0;
            local_37c = iVar20;
            local_370 = *(undefined8 *)*pauVar1;
            uStack_368 = *(undefined8 *)(*pauVar1 + 8);
            local_360 = *(undefined8 *)*pauVar2;
            uStack_358 = *(undefined8 *)(*pauVar2 + 8);
            local_350 = *(undefined8 *)*pauVar3;
            uStack_348 = *(undefined8 *)(*pauVar3 + 8);
            local_320 = auVar159;
            local_280 = auVar25;
            if ((pGVar113->mask & (ray->super_RayK<1>).mask) != 0) {
              local_4c0[0] = auVar159;
              fVar144 = 1.0 / auVar121._0_4_;
              local_300[0] = fVar144 * (auVar208._0_4_ + 0.0);
              local_300[1] = fVar144 * (auVar208._4_4_ + 1.0);
              local_300[2] = fVar144 * (auVar208._8_4_ + 2.0);
              local_300[3] = fVar144 * (auVar208._12_4_ + 3.0);
              fStack_2f0 = fVar144 * (auVar208._16_4_ + 4.0);
              fStack_2ec = fVar144 * (auVar208._20_4_ + 5.0);
              fStack_2e8 = fVar144 * (auVar208._24_4_ + 6.0);
              fStack_2e4 = auVar208._28_4_ + 7.0;
              local_280._0_8_ = auVar22._0_8_;
              local_280._8_8_ = auVar22._8_8_;
              local_2e0 = local_280._0_8_;
              uStack_2d8 = local_280._8_8_;
              uStack_2d0 = 0;
              uStack_2c8 = 0;
              local_2c0 = local_3a0;
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar25 = vblendvps_avx(auVar138,local_3a0,auVar159);
              auVar178 = vshufps_avx(auVar25,auVar25,0xb1);
              auVar178 = vminps_avx(auVar25,auVar178);
              auVar126 = vshufpd_avx(auVar178,auVar178,5);
              auVar178 = vminps_avx(auVar178,auVar126);
              auVar126 = vpermpd_avx2(auVar178,0x4e);
              auVar178 = vminps_avx(auVar178,auVar126);
              auVar25 = vcmpps_avx(auVar25,auVar178,0);
              auVar178 = auVar159 & auVar25;
              if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar178 >> 0x7f,0) != '\0') ||
                    (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar178 >> 0xbf,0) != '\0') ||
                  (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar178[0x1f] < '\0') {
                auVar159 = vandps_avx(auVar25,auVar159);
              }
              uVar108 = vmovmskps_avx(auVar159);
              uVar7 = 0;
              for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
                uVar7 = uVar7 + 1;
              }
              uVar110 = (ulong)uVar7;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar113->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar144 = local_300[uVar110];
                fVar179 = *(float *)((long)&local_2e0 + uVar110 * 4);
                fVar181 = 1.0 - fVar144;
                fVar180 = fVar181 * fVar181 * -3.0;
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * fVar181)),
                                          ZEXT416((uint)(fVar144 * fVar181)),ZEXT416(0xc0000000));
                auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar144 * fVar181)),
                                          ZEXT416((uint)(fVar144 * fVar144)),ZEXT416(0x40000000));
                fVar181 = auVar22._0_4_ * 3.0;
                fVar182 = auVar11._0_4_ * 3.0;
                fVar183 = fVar144 * fVar144 * 3.0;
                auVar191 = ZEXT3264(local_5e0);
                auVar169._0_4_ = fVar183 * local_650;
                auVar169._4_4_ = fVar183 * fStack_64c;
                auVar169._8_4_ = fVar183 * fStack_648;
                auVar169._12_4_ = fVar183 * fStack_644;
                auVar146._4_4_ = fVar182;
                auVar146._0_4_ = fVar182;
                auVar146._8_4_ = fVar182;
                auVar146._12_4_ = fVar182;
                auVar22 = vfmadd132ps_fma(auVar146,auVar169,*pauVar3);
                auVar162._4_4_ = fVar181;
                auVar162._0_4_ = fVar181;
                auVar162._8_4_ = fVar181;
                auVar162._12_4_ = fVar181;
                auVar22 = vfmadd132ps_fma(auVar162,auVar22,*pauVar2);
                auVar147._4_4_ = fVar180;
                auVar147._0_4_ = fVar180;
                auVar147._8_4_ = fVar180;
                auVar147._12_4_ = fVar180;
                auVar22 = vfmadd132ps_fma(auVar147,auVar22,*pauVar1);
                auVar161 = ZEXT1664(auVar22);
                (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar110 * 4);
                uVar116 = vmovlps_avx(auVar22);
                *(undefined8 *)&(ray->Ng).field_0 = uVar116;
                fVar180 = (float)vextractps_avx(auVar22,2);
                (ray->Ng).field_0.field_0.z = fVar180;
                ray->u = fVar144;
                ray->v = fVar179;
                ray->primID = uVar109;
                ray->geomID = uVar107;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_680._0_16_ = *pauVar2;
                local_580 = ZEXT1632(*pauVar3);
                _local_500 = ZEXT1632(*pauVar4);
                local_6a0 = local_3e0;
                local_720 = local_3a0;
                local_7f0 = prim;
                local_7f8 = context;
                local_800 = pre;
                do {
                  local_5a4 = local_300[uVar110];
                  local_5a0 = *(undefined4 *)((long)&local_2e0 + uVar110 * 4);
                  local_7e0._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar110 * 4);
                  local_750.context = context->user;
                  fVar179 = 1.0 - local_5a4;
                  fVar144 = fVar179 * fVar179 * -3.0;
                  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                            ZEXT416((uint)(local_5a4 * fVar179)),ZEXT416(0xc0000000)
                                           );
                  auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar179)),
                                            ZEXT416((uint)(local_5a4 * local_5a4)),
                                            ZEXT416(0x40000000));
                  fVar179 = auVar22._0_4_ * 3.0;
                  fVar180 = auVar11._0_4_ * 3.0;
                  fVar181 = local_5a4 * local_5a4 * 3.0;
                  auVar172._0_4_ = fVar181 * (float)local_500._0_4_;
                  auVar172._4_4_ = fVar181 * (float)local_500._4_4_;
                  auVar172._8_4_ = fVar181 * fStack_4f8;
                  auVar172._12_4_ = fVar181 * fStack_4f4;
                  auVar152._4_4_ = fVar180;
                  auVar152._0_4_ = fVar180;
                  auVar152._8_4_ = fVar180;
                  auVar152._12_4_ = fVar180;
                  auVar22 = vfmadd132ps_fma(auVar152,auVar172,local_580._0_16_);
                  auVar165._4_4_ = fVar179;
                  auVar165._0_4_ = fVar179;
                  auVar165._8_4_ = fVar179;
                  auVar165._12_4_ = fVar179;
                  auVar22 = vfmadd132ps_fma(auVar165,auVar22,local_680._0_16_);
                  auVar153._4_4_ = fVar144;
                  auVar153._0_4_ = fVar144;
                  auVar153._8_4_ = fVar144;
                  auVar153._12_4_ = fVar144;
                  auVar101._8_8_ = uStack_758;
                  auVar101._0_8_ = local_760;
                  auVar22 = vfmadd132ps_fma(auVar153,auVar22,auVar101);
                  local_5b0 = vmovlps_avx(auVar22);
                  local_5a8 = vextractps_avx(auVar22,2);
                  local_59c = (int)local_788;
                  local_598 = (int)local_7e8;
                  local_594 = (local_750.context)->instID[0];
                  local_590 = (local_750.context)->instPrimID[0];
                  local_804 = -1;
                  local_750.valid = &local_804;
                  local_750.geometryUserPtr = pGVar113->userPtr;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_5b0;
                  local_750.N = 1;
                  local_7c0._0_8_ = uVar110;
                  if (pGVar113->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018cea88:
                    p_Var21 = context->args->filter;
                    if (p_Var21 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar113->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var21)(&local_750);
                        auVar216 = ZEXT3264(_local_520);
                        auVar201 = ZEXT3264(local_620);
                        auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                                      CONCAT424(fStack_5e8,
                                                                CONCAT420(fStack_5ec,
                                                                          CONCAT416(fStack_5f0,
                                                                                    CONCAT412(
                                                  fStack_5f4,
                                                  CONCAT48(fStack_5f8,CONCAT44(fStack_5fc,local_600)
                                                          )))))));
                        auVar223 = ZEXT3264(local_6e0);
                        auVar211 = ZEXT3264(local_6c0);
                        auVar205 = ZEXT3264(local_720);
                        auVar208 = ZEXT3264(local_6a0);
                        uVar110 = local_7c0._0_8_;
                        prim = local_7f0;
                        context = local_7f8;
                        pre = local_800;
                        fVar145 = (float)local_780._0_4_;
                        fVar229 = (float)local_700;
                        fVar232 = local_700._4_4_;
                        fVar131 = (float)uStack_6f8;
                        fVar233 = uStack_6f8._4_4_;
                        fVar234 = (float)uStack_6f0;
                        fVar235 = uStack_6f0._4_4_;
                        fVar236 = (float)uStack_6e8;
                      }
                      if (*local_750.valid == 0) goto LAB_018ceb90;
                    }
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                         *(float *)local_750.hit;
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_750.hit + 4);
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_750.hit + 8);
                    *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                    *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                    *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                    *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                    *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                    *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                  }
                  else {
                    (*pGVar113->intersectionFilterN)(&local_750);
                    auVar216 = ZEXT3264(_local_520);
                    auVar201 = ZEXT3264(local_620);
                    auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                                  CONCAT424(fStack_5e8,
                                                            CONCAT420(fStack_5ec,
                                                                      CONCAT416(fStack_5f0,
                                                                                CONCAT412(fStack_5f4
                                                                                          ,CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
                    auVar223 = ZEXT3264(local_6e0);
                    auVar211 = ZEXT3264(local_6c0);
                    auVar205 = ZEXT3264(local_720);
                    auVar208 = ZEXT3264(local_6a0);
                    uVar110 = local_7c0._0_8_;
                    prim = local_7f0;
                    context = local_7f8;
                    pre = local_800;
                    fVar145 = (float)local_780._0_4_;
                    fVar229 = (float)local_700;
                    fVar232 = local_700._4_4_;
                    fVar131 = (float)uStack_6f8;
                    fVar233 = uStack_6f8._4_4_;
                    fVar234 = (float)uStack_6f0;
                    fVar235 = uStack_6f0._4_4_;
                    fVar236 = (float)uStack_6e8;
                    if (*local_750.valid != 0) goto LAB_018cea88;
LAB_018ceb90:
                    (ray->super_RayK<1>).tfar = (float)local_7e0._0_4_;
                  }
                  *(undefined4 *)(local_4c0[0] + uVar110 * 4) = 0;
                  auVar178 = local_4c0[0];
                  fVar144 = (ray->super_RayK<1>).tfar;
                  auVar130._4_4_ = fVar144;
                  auVar130._0_4_ = fVar144;
                  auVar130._8_4_ = fVar144;
                  auVar130._12_4_ = fVar144;
                  auVar130._16_4_ = fVar144;
                  auVar130._20_4_ = fVar144;
                  auVar130._24_4_ = fVar144;
                  auVar130._28_4_ = fVar144;
                  auVar25 = vcmpps_avx(auVar205._0_32_,auVar130,2);
                  auVar159 = vandps_avx(auVar25,local_4c0[0]);
                  local_4c0[0] = auVar159;
                  auVar25 = auVar178 & auVar25;
                  bVar95 = (auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar96 = (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar94 = (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar93 = SUB321(auVar25 >> 0x7f,0) != '\0';
                  bVar92 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar91 = SUB321(auVar25 >> 0xbf,0) != '\0';
                  bVar90 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar89 = auVar25[0x1f] < '\0';
                  auVar191 = ZEXT3264(local_5e0);
                  if (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) || bVar90)
                      || bVar89) {
                    auVar142._8_4_ = 0x7f800000;
                    auVar142._0_8_ = 0x7f8000007f800000;
                    auVar142._12_4_ = 0x7f800000;
                    auVar142._16_4_ = 0x7f800000;
                    auVar142._20_4_ = 0x7f800000;
                    auVar142._24_4_ = 0x7f800000;
                    auVar142._28_4_ = 0x7f800000;
                    auVar25 = vblendvps_avx(auVar142,auVar205._0_32_,auVar159);
                    auVar178 = vshufps_avx(auVar25,auVar25,0xb1);
                    auVar178 = vminps_avx(auVar25,auVar178);
                    auVar126 = vshufpd_avx(auVar178,auVar178,5);
                    auVar178 = vminps_avx(auVar178,auVar126);
                    auVar126 = vpermpd_avx2(auVar178,0x4e);
                    auVar178 = vminps_avx(auVar178,auVar126);
                    auVar25 = vcmpps_avx(auVar25,auVar178,0);
                    auVar126 = auVar159 & auVar25;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0x7f,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0xbf,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar126[0x1f] < '\0') {
                      auVar159 = vandps_avx(auVar25,auVar159);
                    }
                    uVar109 = vmovmskps_avx(auVar159);
                    uVar107 = 0;
                    for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                      uVar107 = uVar107 + 1;
                    }
                    uVar110 = (ulong)uVar107;
                  }
                  auVar161 = ZEXT3264(auVar178);
                } while (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) ||
                         bVar90) || bVar89);
              }
            }
          }
          auVar143 = ZEXT3264(local_540);
        }
      }
      if (8 < iVar20) {
        _local_520 = auVar216._0_32_;
        local_260._4_4_ = iVar20;
        local_260._0_4_ = iVar20;
        local_260._8_4_ = iVar20;
        local_260._12_4_ = iVar20;
        local_260._16_4_ = iVar20;
        local_260._20_4_ = iVar20;
        local_260._24_4_ = iVar20;
        local_260._28_4_ = iVar20;
        local_140 = fVar145;
        fStack_13c = fVar145;
        fStack_138 = fVar145;
        fStack_134 = fVar145;
        fStack_130 = fVar145;
        fStack_12c = fVar145;
        fStack_128 = fVar145;
        fStack_124 = fVar145;
        local_160 = local_560._0_4_;
        uStack_15c = local_560._0_4_;
        uStack_158 = local_560._0_4_;
        uStack_154 = local_560._0_4_;
        uStack_150 = local_560._0_4_;
        uStack_14c = local_560._0_4_;
        uStack_148 = local_560._0_4_;
        uStack_144 = local_560._0_4_;
        local_180 = 1.0 / (float)local_400._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        lVar111 = 8;
        local_6a0 = auVar208._0_32_;
        local_720 = auVar205._0_32_;
        do {
          auVar159 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 * 4 + lVar29);
          auVar25 = *(undefined1 (*) [32])(lVar29 + 0x2227768 + lVar111 * 4);
          auVar178 = *(undefined1 (*) [32])(lVar29 + 0x2227bec + lVar111 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar29 + 0x2228070 + lVar111 * 4);
          auVar106 = *(undefined1 (*) [28])*pauVar5;
          auVar217._0_4_ = auVar197._0_4_ * *(float *)*pauVar5;
          auVar217._4_4_ = auVar197._4_4_ * *(float *)(*pauVar5 + 4);
          auVar217._8_4_ = auVar197._8_4_ * *(float *)(*pauVar5 + 8);
          auVar217._12_4_ = auVar197._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar217._16_4_ = auVar197._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar217._20_4_ = auVar197._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar217._28_36_ = auVar216._28_36_;
          auVar217._24_4_ = auVar197._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar216._0_4_ = fVar229 * *(float *)*pauVar5;
          auVar216._4_4_ = fVar232 * *(float *)(*pauVar5 + 4);
          auVar216._8_4_ = fVar131 * *(float *)(*pauVar5 + 8);
          auVar216._12_4_ = fVar233 * *(float *)(*pauVar5 + 0xc);
          auVar216._16_4_ = fVar234 * *(float *)(*pauVar5 + 0x10);
          auVar216._20_4_ = fVar235 * *(float *)(*pauVar5 + 0x14);
          auVar216._28_36_ = auVar161._28_36_;
          auVar216._24_4_ = fVar236 * *(float *)(*pauVar5 + 0x18);
          auVar22 = vfmadd231ps_fma(auVar217._0_32_,auVar178,auVar211._0_32_);
          auVar11 = vfmadd231ps_fma(auVar216._0_32_,auVar178,auVar223._0_32_);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar25,auVar201._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,auVar143._0_32_);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar159,auVar191._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar159,local_4e0);
          auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 * 4 + lVar29);
          auVar136 = *(undefined1 (*) [32])(lVar29 + 0x2229b88 + lVar111 * 4);
          auVar26 = *(undefined1 (*) [32])(lVar29 + 0x222a00c + lVar111 * 4);
          pfVar6 = (float *)(lVar29 + 0x222a490 + lVar111 * 4);
          fVar179 = *pfVar6;
          fVar180 = pfVar6[1];
          fVar181 = pfVar6[2];
          fVar182 = pfVar6[3];
          fVar183 = pfVar6[4];
          fVar184 = pfVar6[5];
          fVar97 = pfVar6[6];
          auVar59._4_4_ = auVar197._4_4_ * fVar180;
          auVar59._0_4_ = auVar197._0_4_ * fVar179;
          auVar59._8_4_ = auVar197._8_4_ * fVar181;
          auVar59._12_4_ = auVar197._12_4_ * fVar182;
          auVar59._16_4_ = auVar197._16_4_ * fVar183;
          auVar59._20_4_ = auVar197._20_4_ * fVar184;
          auVar59._24_4_ = auVar197._24_4_ * fVar97;
          auVar59._28_4_ = local_4e0._28_4_;
          auVar198._0_4_ = fVar229 * fVar179;
          auVar198._4_4_ = fVar232 * fVar180;
          auVar198._8_4_ = fVar131 * fVar181;
          auVar198._12_4_ = fVar233 * fVar182;
          auVar198._16_4_ = fVar234 * fVar183;
          auVar198._20_4_ = fVar235 * fVar184;
          auVar198._28_36_ = auVar197._28_36_;
          auVar198._24_4_ = fVar236 * fVar97;
          auVar12 = vfmadd231ps_fma(auVar59,auVar26,auVar211._0_32_);
          auVar13 = vfmadd231ps_fma(auVar198._0_32_,auVar26,auVar223._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar136,auVar201._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar136,auVar143._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,auVar191._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar126,local_4e0);
          local_220 = ZEXT1632(auVar12);
          local_240 = ZEXT1632(auVar22);
          _local_500 = vsubps_avx(local_220,local_240);
          local_200 = ZEXT1632(auVar13);
          local_580 = ZEXT1632(auVar11);
          _local_480 = vsubps_avx(local_200,local_580);
          auVar60._4_4_ = auVar11._4_4_ * local_500._4_4_;
          auVar60._0_4_ = auVar11._0_4_ * local_500._0_4_;
          auVar60._8_4_ = auVar11._8_4_ * local_500._8_4_;
          auVar60._12_4_ = auVar11._12_4_ * local_500._12_4_;
          auVar60._16_4_ = local_500._16_4_ * 0.0;
          auVar60._20_4_ = local_500._20_4_ * 0.0;
          auVar60._24_4_ = local_500._24_4_ * 0.0;
          auVar60._28_4_ = auVar126._28_4_;
          fVar145 = local_480._0_4_;
          auVar161._0_4_ = auVar22._0_4_ * fVar145;
          fVar131 = local_480._4_4_;
          auVar161._4_4_ = auVar22._4_4_ * fVar131;
          fVar233 = local_480._8_4_;
          auVar161._8_4_ = auVar22._8_4_ * fVar233;
          fVar234 = local_480._12_4_;
          auVar161._12_4_ = auVar22._12_4_ * fVar234;
          fVar235 = local_480._16_4_;
          auVar161._16_4_ = fVar235 * 0.0;
          fVar236 = local_480._20_4_;
          auVar161._20_4_ = fVar236 * 0.0;
          fVar144 = local_480._24_4_;
          auVar161._28_36_ = auVar143._28_36_;
          auVar161._24_4_ = fVar144 * 0.0;
          auVar216 = ZEXT3264(auVar178);
          auVar27 = vsubps_avx(auVar60,auVar161._0_32_);
          local_780._0_4_ = auVar106._0_4_;
          local_780._4_4_ = auVar106._4_4_;
          fStack_778 = auVar106._8_4_;
          fStack_774 = auVar106._12_4_;
          fStack_770 = auVar106._16_4_;
          fStack_76c = auVar106._20_4_;
          fStack_768 = auVar106._24_4_;
          auVar158._0_4_ = (float)local_100 * (float)local_780._0_4_;
          auVar158._4_4_ = local_100._4_4_ * (float)local_780._4_4_;
          auVar158._8_4_ = (float)uStack_f8 * fStack_778;
          auVar158._12_4_ = uStack_f8._4_4_ * fStack_774;
          auVar158._16_4_ = (float)uStack_f0 * fStack_770;
          auVar158._20_4_ = uStack_f0._4_4_ * fStack_76c;
          auVar158._24_4_ = (float)uStack_e8 * fStack_768;
          auVar158._28_4_ = 0;
          auVar22 = vfmadd231ps_fma(auVar158,auVar178,local_e0);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar25,local_c0);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),local_a0,auVar159);
          auVar161 = ZEXT1664(auVar22);
          auVar61._4_4_ = local_100._4_4_ * fVar180;
          auVar61._0_4_ = (float)local_100 * fVar179;
          auVar61._8_4_ = (float)uStack_f8 * fVar181;
          auVar61._12_4_ = uStack_f8._4_4_ * fVar182;
          auVar61._16_4_ = (float)uStack_f0 * fVar183;
          auVar61._20_4_ = uStack_f0._4_4_ * fVar184;
          auVar61._24_4_ = (float)uStack_e8 * fVar97;
          auVar61._28_4_ = uStack_e8._4_4_;
          auVar12 = vfmadd231ps_fma(auVar61,auVar26,local_e0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar136,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_a0);
          auVar62._4_4_ = fVar131 * fVar131;
          auVar62._0_4_ = fVar145 * fVar145;
          auVar62._8_4_ = fVar233 * fVar233;
          auVar62._12_4_ = fVar234 * fVar234;
          auVar62._16_4_ = fVar235 * fVar235;
          auVar62._20_4_ = fVar236 * fVar236;
          auVar62._24_4_ = fVar144 * fVar144;
          auVar62._28_4_ = local_a0._28_4_;
          auVar13 = vfmadd231ps_fma(auVar62,_local_500,_local_500);
          local_680._0_32_ = ZEXT1632(auVar12);
          auVar128 = vmaxps_avx(ZEXT1632(auVar22),local_680._0_32_);
          auVar203._0_4_ = auVar128._0_4_ * auVar128._0_4_ * auVar13._0_4_;
          auVar203._4_4_ = auVar128._4_4_ * auVar128._4_4_ * auVar13._4_4_;
          auVar203._8_4_ = auVar128._8_4_ * auVar128._8_4_ * auVar13._8_4_;
          auVar203._12_4_ = auVar128._12_4_ * auVar128._12_4_ * auVar13._12_4_;
          auVar203._16_4_ = auVar128._16_4_ * auVar128._16_4_ * 0.0;
          auVar203._20_4_ = auVar128._20_4_ * auVar128._20_4_ * 0.0;
          auVar203._24_4_ = auVar128._24_4_ * auVar128._24_4_ * 0.0;
          auVar203._28_4_ = 0;
          auVar63._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar63._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar63._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar63._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar63._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar63._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar63._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar63._28_4_ = pfVar6[7];
          auVar128 = vcmpps_avx(auVar63,auVar203,2);
          local_380 = (int)lVar111;
          auVar204._4_4_ = local_380;
          auVar204._0_4_ = local_380;
          auVar204._8_4_ = local_380;
          auVar204._12_4_ = local_380;
          auVar204._16_4_ = local_380;
          auVar204._20_4_ = local_380;
          auVar204._24_4_ = local_380;
          auVar204._28_4_ = local_380;
          auVar27 = vpor_avx2(auVar204,_DAT_0205a920);
          auVar28 = vpcmpgtd_avx2(local_260,auVar27);
          auVar27 = auVar28 & auVar128;
          auVar23 = *pauVar5;
          fVar229 = (float)local_700;
          fVar232 = local_700._4_4_;
          fVar131 = (float)uStack_6f8;
          fVar233 = uStack_6f8._4_4_;
          fVar234 = (float)uStack_6f0;
          fVar235 = uStack_6f0._4_4_;
          fVar236 = (float)uStack_6e8;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
LAB_018ce0e3:
            _local_780 = auVar23;
            auVar223 = ZEXT3264(local_6e0);
            auVar211 = ZEXT3264(local_6c0);
            auVar205 = ZEXT3264(local_720);
            auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                          CONCAT424(fStack_5e8,
                                                    CONCAT420(fStack_5ec,
                                                              CONCAT416(fStack_5f0,
                                                                        CONCAT412(fStack_5f4,
                                                                                  CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            auVar201 = ZEXT3264(local_620);
            auVar191 = ZEXT3264(local_5e0);
          }
          else {
            local_400 = vandps_avx(auVar28,auVar128);
            auVar64._4_4_ = (float)local_520._4_4_ * fVar180;
            auVar64._0_4_ = (float)local_520._0_4_ * fVar179;
            auVar64._8_4_ = fStack_518 * fVar181;
            auVar64._12_4_ = fStack_514 * fVar182;
            auVar64._16_4_ = fStack_510 * fVar183;
            auVar64._20_4_ = fStack_50c * fVar184;
            auVar64._24_4_ = fStack_508 * fVar97;
            auVar64._28_4_ = auVar128._28_4_;
            auVar12 = vfmadd213ps_fma(auVar26,local_1a0,auVar64);
            auVar12 = vfmadd213ps_fma(auVar136,local_440,ZEXT1632(auVar12));
            auVar12 = vfmadd132ps_fma(auVar126,ZEXT1632(auVar12),local_460);
            auVar65._4_4_ = (float)local_520._4_4_ * (float)local_780._4_4_;
            auVar65._0_4_ = (float)local_520._0_4_ * (float)local_780._0_4_;
            auVar65._8_4_ = fStack_518 * fStack_778;
            auVar65._12_4_ = fStack_514 * fStack_774;
            auVar65._16_4_ = fStack_510 * fStack_770;
            auVar65._20_4_ = fStack_50c * fStack_76c;
            auVar65._24_4_ = fStack_508 * fStack_768;
            auVar65._28_4_ = auVar128._28_4_;
            auVar13 = vfmadd213ps_fma(auVar178,local_1a0,auVar65);
            auVar13 = vfmadd213ps_fma(auVar25,local_440,ZEXT1632(auVar13));
            auVar25 = *(undefined1 (*) [32])(lVar29 + 0x22284f4 + lVar111 * 4);
            auVar178 = *(undefined1 (*) [32])(lVar29 + 0x2228978 + lVar111 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar29 + 0x2228dfc + lVar111 * 4);
            pfVar6 = (float *)(lVar29 + 0x2229280 + lVar111 * 4);
            fVar145 = *pfVar6;
            fVar144 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar181 = pfVar6[4];
            fVar182 = pfVar6[5];
            fVar183 = pfVar6[6];
            auVar199._0_4_ = local_600 * fVar145;
            auVar199._4_4_ = fStack_5fc * fVar144;
            auVar199._8_4_ = fStack_5f8 * fVar179;
            auVar199._12_4_ = fStack_5f4 * fVar180;
            auVar199._16_4_ = fStack_5f0 * fVar181;
            auVar199._20_4_ = fStack_5ec * fVar182;
            auVar199._24_4_ = fStack_5e8 * fVar183;
            auVar199._28_4_ = 0;
            auVar214._0_4_ = (float)local_700 * fVar145;
            auVar214._4_4_ = local_700._4_4_ * fVar144;
            auVar214._8_4_ = (float)uStack_6f8 * fVar179;
            auVar214._12_4_ = uStack_6f8._4_4_ * fVar180;
            auVar214._16_4_ = (float)uStack_6f0 * fVar181;
            auVar214._20_4_ = uStack_6f0._4_4_ * fVar182;
            auVar214._24_4_ = (float)uStack_6e8 * fVar183;
            auVar214._28_4_ = 0;
            auVar66._4_4_ = fVar144 * (float)local_520._4_4_;
            auVar66._0_4_ = fVar145 * (float)local_520._0_4_;
            auVar66._8_4_ = fVar179 * fStack_518;
            auVar66._12_4_ = fVar180 * fStack_514;
            auVar66._16_4_ = fVar181 * fStack_510;
            auVar66._20_4_ = fVar182 * fStack_50c;
            auVar66._24_4_ = fVar183 * fStack_508;
            auVar66._28_4_ = pfVar6[7];
            auVar14 = vfmadd231ps_fma(auVar199,auVar126,local_6c0);
            auVar15 = vfmadd231ps_fma(auVar214,auVar126,local_6e0);
            auVar16 = vfmadd231ps_fma(auVar66,local_1a0,auVar126);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar178,local_620);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar178,local_540);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_440,auVar178);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,local_5e0);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar25,local_4e0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_460,auVar25);
            pfVar6 = (float *)(lVar29 + 0x222b6a0 + lVar111 * 4);
            fVar145 = *pfVar6;
            fVar144 = pfVar6[1];
            fVar179 = pfVar6[2];
            fVar180 = pfVar6[3];
            fVar181 = pfVar6[4];
            fVar182 = pfVar6[5];
            fVar183 = pfVar6[6];
            auVar67._4_4_ = fStack_5fc * fVar144;
            auVar67._0_4_ = local_600 * fVar145;
            auVar67._8_4_ = fStack_5f8 * fVar179;
            auVar67._12_4_ = fStack_5f4 * fVar180;
            auVar67._16_4_ = fStack_5f0 * fVar181;
            auVar67._20_4_ = fStack_5ec * fVar182;
            auVar67._24_4_ = fStack_5e8 * fVar183;
            auVar67._28_4_ = fStack_5e4;
            auVar68._4_4_ = local_700._4_4_ * fVar144;
            auVar68._0_4_ = (float)local_700 * fVar145;
            auVar68._8_4_ = (float)uStack_6f8 * fVar179;
            auVar68._12_4_ = uStack_6f8._4_4_ * fVar180;
            auVar68._16_4_ = (float)uStack_6f0 * fVar181;
            auVar68._20_4_ = uStack_6f0._4_4_ * fVar182;
            auVar68._24_4_ = (float)uStack_6e8 * fVar183;
            auVar68._28_4_ = uStack_6e8._4_4_;
            auVar69._4_4_ = fVar144 * (float)local_520._4_4_;
            auVar69._0_4_ = fVar145 * (float)local_520._0_4_;
            auVar69._8_4_ = fVar179 * fStack_518;
            auVar69._12_4_ = fVar180 * fStack_514;
            auVar69._16_4_ = fVar181 * fStack_510;
            auVar69._20_4_ = fVar182 * fStack_50c;
            auVar69._24_4_ = fVar183 * fStack_508;
            auVar69._28_4_ = pfVar6[7];
            auVar25 = *(undefined1 (*) [32])(lVar29 + 0x222b21c + lVar111 * 4);
            auVar17 = vfmadd231ps_fma(auVar67,auVar25,local_6c0);
            auVar18 = vfmadd231ps_fma(auVar68,auVar25,local_6e0);
            auVar117 = vfmadd231ps_fma(auVar69,local_1a0,auVar25);
            auVar25 = *(undefined1 (*) [32])(lVar29 + 0x222ad98 + lVar111 * 4);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar25,local_620);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar25,local_540);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_440,auVar25);
            auVar25 = *(undefined1 (*) [32])(lVar29 + 0x222a914 + lVar111 * 4);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar25,local_5e0);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar25,local_4e0);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_460,auVar25);
            auVar25 = vandps_avx(ZEXT1632(auVar14),local_1c0);
            auVar178 = vandps_avx(ZEXT1632(auVar15),local_1c0);
            auVar178 = vmaxps_avx(auVar25,auVar178);
            auVar25 = vandps_avx(ZEXT1632(auVar16),local_1c0);
            auVar25 = vmaxps_avx(auVar178,auVar25);
            auVar105._4_4_ = fStack_13c;
            auVar105._0_4_ = local_140;
            auVar105._8_4_ = fStack_138;
            auVar105._12_4_ = fStack_134;
            auVar105._16_4_ = fStack_130;
            auVar105._20_4_ = fStack_12c;
            auVar105._24_4_ = fStack_128;
            auVar105._28_4_ = fStack_124;
            auVar25 = vcmpps_avx(auVar25,auVar105,1);
            auVar126 = vblendvps_avx(ZEXT1632(auVar14),_local_500,auVar25);
            auVar136 = vblendvps_avx(ZEXT1632(auVar15),_local_480,auVar25);
            auVar25 = vandps_avx(ZEXT1632(auVar17),local_1c0);
            auVar178 = vandps_avx(ZEXT1632(auVar18),local_1c0);
            auVar178 = vmaxps_avx(auVar25,auVar178);
            auVar25 = vandps_avx(local_1c0,ZEXT1632(auVar117));
            auVar25 = vmaxps_avx(auVar178,auVar25);
            auVar178 = vcmpps_avx(auVar25,auVar105,1);
            auVar25 = vblendvps_avx(ZEXT1632(auVar17),_local_500,auVar178);
            auVar178 = vblendvps_avx(ZEXT1632(auVar18),_local_480,auVar178);
            auVar13 = vfmadd213ps_fma(auVar159,local_460,ZEXT1632(auVar13));
            auVar14 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar136,auVar136);
            auVar159 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar145 = auVar159._0_4_;
            fVar144 = auVar159._4_4_;
            fVar179 = auVar159._8_4_;
            fVar180 = auVar159._12_4_;
            fVar181 = auVar159._16_4_;
            fVar182 = auVar159._20_4_;
            fVar183 = auVar159._24_4_;
            auVar70._4_4_ = fVar144 * fVar144 * fVar144 * auVar14._4_4_ * -0.5;
            auVar70._0_4_ = fVar145 * fVar145 * fVar145 * auVar14._0_4_ * -0.5;
            auVar70._8_4_ = fVar179 * fVar179 * fVar179 * auVar14._8_4_ * -0.5;
            auVar70._12_4_ = fVar180 * fVar180 * fVar180 * auVar14._12_4_ * -0.5;
            auVar70._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar70._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar70._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar70._28_4_ = 0;
            auVar222._8_4_ = 0x3fc00000;
            auVar222._0_8_ = 0x3fc000003fc00000;
            auVar222._12_4_ = 0x3fc00000;
            auVar222._16_4_ = 0x3fc00000;
            auVar222._20_4_ = 0x3fc00000;
            auVar222._24_4_ = 0x3fc00000;
            auVar222._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar70,auVar222,auVar159);
            fVar145 = auVar14._0_4_;
            fVar144 = auVar14._4_4_;
            auVar71._4_4_ = auVar136._4_4_ * fVar144;
            auVar71._0_4_ = auVar136._0_4_ * fVar145;
            fVar179 = auVar14._8_4_;
            auVar71._8_4_ = auVar136._8_4_ * fVar179;
            fVar180 = auVar14._12_4_;
            auVar71._12_4_ = auVar136._12_4_ * fVar180;
            auVar71._16_4_ = auVar136._16_4_ * 0.0;
            auVar71._20_4_ = auVar136._20_4_ * 0.0;
            auVar71._24_4_ = auVar136._24_4_ * 0.0;
            auVar71._28_4_ = auVar136._28_4_;
            auVar72._4_4_ = fVar144 * -auVar126._4_4_;
            auVar72._0_4_ = fVar145 * -auVar126._0_4_;
            auVar72._8_4_ = fVar179 * -auVar126._8_4_;
            auVar72._12_4_ = fVar180 * -auVar126._12_4_;
            auVar72._16_4_ = -auVar126._16_4_ * 0.0;
            auVar72._20_4_ = -auVar126._20_4_ * 0.0;
            auVar72._24_4_ = -auVar126._24_4_ * 0.0;
            auVar72._28_4_ = auVar159._28_4_;
            auVar14 = vfmadd213ps_fma(auVar25,auVar25,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar178,auVar178);
            auVar159 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar73._28_4_ = local_460._28_4_;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar144 * 0.0,fVar145 * 0.0))));
            fVar145 = auVar159._0_4_;
            fVar144 = auVar159._4_4_;
            fVar179 = auVar159._8_4_;
            fVar180 = auVar159._12_4_;
            fVar181 = auVar159._16_4_;
            fVar182 = auVar159._20_4_;
            fVar183 = auVar159._24_4_;
            auVar74._4_4_ = fVar144 * fVar144 * fVar144 * auVar14._4_4_ * -0.5;
            auVar74._0_4_ = fVar145 * fVar145 * fVar145 * auVar14._0_4_ * -0.5;
            auVar74._8_4_ = fVar179 * fVar179 * fVar179 * auVar14._8_4_ * -0.5;
            auVar74._12_4_ = fVar180 * fVar180 * fVar180 * auVar14._12_4_ * -0.5;
            auVar74._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar74._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar74._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar74._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar74,auVar222,auVar159);
            fVar145 = auVar14._0_4_;
            fVar144 = auVar14._4_4_;
            auVar75._4_4_ = auVar178._4_4_ * fVar144;
            auVar75._0_4_ = auVar178._0_4_ * fVar145;
            fVar179 = auVar14._8_4_;
            auVar75._8_4_ = auVar178._8_4_ * fVar179;
            fVar180 = auVar14._12_4_;
            auVar75._12_4_ = auVar178._12_4_ * fVar180;
            auVar75._16_4_ = auVar178._16_4_ * 0.0;
            auVar75._20_4_ = auVar178._20_4_ * 0.0;
            auVar75._24_4_ = auVar178._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._4_4_ = fVar144 * -auVar25._4_4_;
            auVar76._0_4_ = fVar145 * -auVar25._0_4_;
            auVar76._8_4_ = fVar179 * -auVar25._8_4_;
            auVar76._12_4_ = fVar180 * -auVar25._12_4_;
            auVar76._16_4_ = -auVar25._16_4_ * 0.0;
            auVar76._20_4_ = -auVar25._20_4_ * 0.0;
            auVar76._24_4_ = -auVar25._24_4_ * 0.0;
            auVar76._28_4_ = auVar159._28_4_;
            auVar77._28_4_ = 0xbf000000;
            auVar77._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar144 * 0.0,fVar145 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar22),local_240);
            auVar159 = ZEXT1632(auVar22);
            auVar15 = vfmadd213ps_fma(auVar72,auVar159,local_580);
            auVar16 = vfmadd213ps_fma(auVar73,auVar159,ZEXT1632(auVar13));
            auVar117 = vfnmadd213ps_fma(auVar71,auVar159,local_240);
            auVar17 = vfmadd213ps_fma(auVar75,local_680._0_32_,local_220);
            auVar192 = vfnmadd213ps_fma(auVar72,auVar159,local_580);
            auVar18 = vfmadd213ps_fma(auVar76,local_680._0_32_,local_200);
            local_7c0 = ZEXT1632(auVar22);
            auVar22 = vfnmadd231ps_fma(ZEXT1632(auVar13),local_7c0,auVar73);
            auVar13 = vfmadd213ps_fma(auVar77,local_680._0_32_,ZEXT1632(auVar12));
            auVar30 = vfnmadd213ps_fma(auVar75,local_680._0_32_,local_220);
            auVar31 = vfnmadd213ps_fma(auVar76,local_680._0_32_,local_200);
            auVar32 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_680._0_32_,auVar77);
            auVar159 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar192));
            auVar25 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar22));
            auVar78._4_4_ = auVar159._4_4_ * auVar22._4_4_;
            auVar78._0_4_ = auVar159._0_4_ * auVar22._0_4_;
            auVar78._8_4_ = auVar159._8_4_ * auVar22._8_4_;
            auVar78._12_4_ = auVar159._12_4_ * auVar22._12_4_;
            auVar78._16_4_ = auVar159._16_4_ * 0.0;
            auVar78._20_4_ = auVar159._20_4_ * 0.0;
            auVar78._24_4_ = auVar159._24_4_ * 0.0;
            auVar78._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar78,ZEXT1632(auVar192),auVar25);
            auVar79._4_4_ = auVar117._4_4_ * auVar25._4_4_;
            auVar79._0_4_ = auVar117._0_4_ * auVar25._0_4_;
            auVar79._8_4_ = auVar117._8_4_ * auVar25._8_4_;
            auVar79._12_4_ = auVar117._12_4_ * auVar25._12_4_;
            auVar79._16_4_ = auVar25._16_4_ * 0.0;
            auVar79._20_4_ = auVar25._20_4_ * 0.0;
            auVar79._24_4_ = auVar25._24_4_ * 0.0;
            auVar79._28_4_ = auVar25._28_4_;
            auVar136 = ZEXT1632(auVar117);
            auVar25 = vsubps_avx(ZEXT1632(auVar17),auVar136);
            auVar128 = ZEXT1632(auVar22);
            auVar22 = vfmsub231ps_fma(auVar79,auVar128,auVar25);
            auVar80._4_4_ = auVar192._4_4_ * auVar25._4_4_;
            auVar80._0_4_ = auVar192._0_4_ * auVar25._0_4_;
            auVar80._8_4_ = auVar192._8_4_ * auVar25._8_4_;
            auVar80._12_4_ = auVar192._12_4_ * auVar25._12_4_;
            auVar80._16_4_ = auVar25._16_4_ * 0.0;
            auVar80._20_4_ = auVar25._20_4_ * 0.0;
            auVar80._24_4_ = auVar25._24_4_ * 0.0;
            auVar80._28_4_ = auVar25._28_4_;
            auVar117 = vfmsub231ps_fma(auVar80,auVar136,auVar159);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar27 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,2);
            local_7e0 = vblendvps_avx(ZEXT1632(auVar30),ZEXT1632(auVar14),auVar27);
            _local_560 = vblendvps_avx(ZEXT1632(auVar31),ZEXT1632(auVar15),auVar27);
            auVar159 = vblendvps_avx(ZEXT1632(auVar32),ZEXT1632(auVar16),auVar27);
            auVar25 = vblendvps_avx(auVar136,ZEXT1632(auVar17),auVar27);
            auVar178 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar18),auVar27);
            auVar126 = vblendvps_avx(auVar128,ZEXT1632(auVar13),auVar27);
            auVar136 = vblendvps_avx(ZEXT1632(auVar17),auVar136,auVar27);
            auVar26 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar192),auVar27);
            auVar22 = vpackssdw_avx(local_400._0_16_,local_400._16_16_);
            _local_780 = ZEXT1632(auVar22);
            auVar128 = vblendvps_avx(ZEXT1632(auVar13),auVar128,auVar27);
            auVar136 = vsubps_avx(auVar136,local_7e0);
            auVar26 = vsubps_avx(auVar26,_local_560);
            auVar28 = vsubps_avx(auVar128,auVar159);
            auVar23 = vsubps_avx(local_7e0,auVar25);
            auVar24 = vsubps_avx(_local_560,auVar178);
            auVar119 = vsubps_avx(auVar159,auVar126);
            auVar175._0_4_ = auVar28._0_4_ * local_7e0._0_4_;
            auVar175._4_4_ = auVar28._4_4_ * local_7e0._4_4_;
            auVar175._8_4_ = auVar28._8_4_ * local_7e0._8_4_;
            auVar175._12_4_ = auVar28._12_4_ * local_7e0._12_4_;
            auVar175._16_4_ = auVar28._16_4_ * local_7e0._16_4_;
            auVar175._20_4_ = auVar28._20_4_ * local_7e0._20_4_;
            auVar175._24_4_ = auVar28._24_4_ * local_7e0._24_4_;
            auVar175._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar175,auVar159,auVar136);
            auVar81._4_4_ = auVar136._4_4_ * local_560._4_4_;
            auVar81._0_4_ = auVar136._0_4_ * local_560._0_4_;
            auVar81._8_4_ = auVar136._8_4_ * local_560._8_4_;
            auVar81._12_4_ = auVar136._12_4_ * local_560._12_4_;
            auVar81._16_4_ = auVar136._16_4_ * local_560._16_4_;
            auVar81._20_4_ = auVar136._20_4_ * local_560._20_4_;
            auVar81._24_4_ = auVar136._24_4_ * local_560._24_4_;
            auVar81._28_4_ = auVar128._28_4_;
            auVar13 = vfmsub231ps_fma(auVar81,local_7e0,auVar26);
            auVar216 = ZEXT864(0) << 0x20;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar176._0_4_ = auVar26._0_4_ * auVar159._0_4_;
            auVar176._4_4_ = auVar26._4_4_ * auVar159._4_4_;
            auVar176._8_4_ = auVar26._8_4_ * auVar159._8_4_;
            auVar176._12_4_ = auVar26._12_4_ * auVar159._12_4_;
            auVar176._16_4_ = auVar26._16_4_ * auVar159._16_4_;
            auVar176._20_4_ = auVar26._20_4_ * auVar159._20_4_;
            auVar176._24_4_ = auVar26._24_4_ * auVar159._24_4_;
            auVar176._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar176,_local_560,auVar28);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar161 = ZEXT1664(auVar13);
            auVar177._0_4_ = auVar119._0_4_ * auVar25._0_4_;
            auVar177._4_4_ = auVar119._4_4_ * auVar25._4_4_;
            auVar177._8_4_ = auVar119._8_4_ * auVar25._8_4_;
            auVar177._12_4_ = auVar119._12_4_ * auVar25._12_4_;
            auVar177._16_4_ = auVar119._16_4_ * auVar25._16_4_;
            auVar177._20_4_ = auVar119._20_4_ * auVar25._20_4_;
            auVar177._24_4_ = auVar119._24_4_ * auVar25._24_4_;
            auVar177._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar177,auVar23,auVar126);
            auVar82._4_4_ = auVar24._4_4_ * auVar126._4_4_;
            auVar82._0_4_ = auVar24._0_4_ * auVar126._0_4_;
            auVar82._8_4_ = auVar24._8_4_ * auVar126._8_4_;
            auVar82._12_4_ = auVar24._12_4_ * auVar126._12_4_;
            auVar82._16_4_ = auVar24._16_4_ * auVar126._16_4_;
            auVar82._20_4_ = auVar24._20_4_ * auVar126._20_4_;
            auVar82._24_4_ = auVar24._24_4_ * auVar126._24_4_;
            auVar82._28_4_ = auVar126._28_4_;
            auVar14 = vfmsub231ps_fma(auVar82,auVar178,auVar119);
            auVar83._4_4_ = auVar23._4_4_ * auVar178._4_4_;
            auVar83._0_4_ = auVar23._0_4_ * auVar178._0_4_;
            auVar83._8_4_ = auVar23._8_4_ * auVar178._8_4_;
            auVar83._12_4_ = auVar23._12_4_ * auVar178._12_4_;
            auVar83._16_4_ = auVar23._16_4_ * auVar178._16_4_;
            auVar83._20_4_ = auVar23._20_4_ * auVar178._20_4_;
            auVar83._24_4_ = auVar23._24_4_ * auVar178._24_4_;
            auVar83._28_4_ = auVar178._28_4_;
            auVar15 = vfmsub231ps_fma(auVar83,auVar24,auVar25);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar25 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
            auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
            auVar12 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
            auVar22 = vpand_avx(auVar12,auVar22);
            auVar25 = vpmovsxwd_avx2(auVar22);
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) {
LAB_018ce3de:
              auVar191 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                            CONCAT816(local_4c0[1]._16_8_,
                                                      CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_
                                                              ))));
            }
            else {
              auVar84._4_4_ = auVar26._4_4_ * auVar119._4_4_;
              auVar84._0_4_ = auVar26._0_4_ * auVar119._0_4_;
              auVar84._8_4_ = auVar26._8_4_ * auVar119._8_4_;
              auVar84._12_4_ = auVar26._12_4_ * auVar119._12_4_;
              auVar84._16_4_ = auVar26._16_4_ * auVar119._16_4_;
              auVar84._20_4_ = auVar26._20_4_ * auVar119._20_4_;
              auVar84._24_4_ = auVar26._24_4_ * auVar119._24_4_;
              auVar84._28_4_ = auVar25._28_4_;
              auVar17 = vfmsub231ps_fma(auVar84,auVar24,auVar28);
              auVar190._0_4_ = auVar23._0_4_ * auVar28._0_4_;
              auVar190._4_4_ = auVar23._4_4_ * auVar28._4_4_;
              auVar190._8_4_ = auVar23._8_4_ * auVar28._8_4_;
              auVar190._12_4_ = auVar23._12_4_ * auVar28._12_4_;
              auVar190._16_4_ = auVar23._16_4_ * auVar28._16_4_;
              auVar190._20_4_ = auVar23._20_4_ * auVar28._20_4_;
              auVar190._24_4_ = auVar23._24_4_ * auVar28._24_4_;
              auVar190._28_4_ = 0;
              auVar16 = vfmsub231ps_fma(auVar190,auVar136,auVar119);
              auVar85._4_4_ = auVar136._4_4_ * auVar24._4_4_;
              auVar85._0_4_ = auVar136._0_4_ * auVar24._0_4_;
              auVar85._8_4_ = auVar136._8_4_ * auVar24._8_4_;
              auVar85._12_4_ = auVar136._12_4_ * auVar24._12_4_;
              auVar85._16_4_ = auVar136._16_4_ * auVar24._16_4_;
              auVar85._20_4_ = auVar136._20_4_ * auVar24._20_4_;
              auVar85._24_4_ = auVar136._24_4_ * auVar24._24_4_;
              auVar85._28_4_ = auVar24._28_4_;
              auVar18 = vfmsub231ps_fma(auVar85,auVar23,auVar26);
              auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar16),ZEXT1632(auVar18));
              auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar17),ZEXT832(0) << 0x20);
              auVar25 = vrcpps_avx(ZEXT1632(auVar15));
              auVar215._8_4_ = 0x3f800000;
              auVar215._0_8_ = &DAT_3f8000003f800000;
              auVar215._12_4_ = 0x3f800000;
              auVar215._16_4_ = 0x3f800000;
              auVar215._20_4_ = 0x3f800000;
              auVar215._24_4_ = 0x3f800000;
              auVar215._28_4_ = 0x3f800000;
              auVar216 = ZEXT3264(auVar215);
              auVar12 = vfnmadd213ps_fma(auVar25,ZEXT1632(auVar15),auVar215);
              auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar25,auVar25);
              auVar86._4_4_ = auVar18._4_4_ * auVar159._4_4_;
              auVar86._0_4_ = auVar18._0_4_ * auVar159._0_4_;
              auVar86._8_4_ = auVar18._8_4_ * auVar159._8_4_;
              auVar86._12_4_ = auVar18._12_4_ * auVar159._12_4_;
              auVar86._16_4_ = auVar159._16_4_ * 0.0;
              auVar86._20_4_ = auVar159._20_4_ * 0.0;
              auVar86._24_4_ = auVar159._24_4_ * 0.0;
              auVar86._28_4_ = auVar159._28_4_;
              auVar16 = vfmadd231ps_fma(auVar86,ZEXT1632(auVar16),_local_560);
              auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar17),local_7e0);
              fVar144 = auVar12._0_4_;
              fVar179 = auVar12._4_4_;
              fVar180 = auVar12._8_4_;
              fVar181 = auVar12._12_4_;
              auVar178 = ZEXT1632(CONCAT412(fVar181 * auVar16._12_4_,
                                            CONCAT48(fVar180 * auVar16._8_4_,
                                                     CONCAT44(fVar179 * auVar16._4_4_,
                                                              fVar144 * auVar16._0_4_))));
              fVar145 = (ray->super_RayK<1>).tfar;
              auVar166._4_4_ = fVar145;
              auVar166._0_4_ = fVar145;
              auVar166._8_4_ = fVar145;
              auVar166._12_4_ = fVar145;
              auVar166._16_4_ = fVar145;
              auVar166._20_4_ = fVar145;
              auVar166._24_4_ = fVar145;
              auVar166._28_4_ = fVar145;
              auVar104._4_4_ = uStack_15c;
              auVar104._0_4_ = local_160;
              auVar104._8_4_ = uStack_158;
              auVar104._12_4_ = uStack_154;
              auVar104._16_4_ = uStack_150;
              auVar104._20_4_ = uStack_14c;
              auVar104._24_4_ = uStack_148;
              auVar104._28_4_ = uStack_144;
              auVar159 = vcmpps_avx(auVar104,auVar178,2);
              auVar25 = vcmpps_avx(auVar178,auVar166,2);
              auVar159 = vandps_avx(auVar25,auVar159);
              auVar12 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
              auVar22 = vpand_avx(auVar22,auVar12);
              auVar159 = vpmovsxwd_avx2(auVar22);
              if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar159 >> 0x7f,0) == '\0') &&
                    (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0xbf,0) == '\0') &&
                  (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar159[0x1f]) goto LAB_018ce3de;
              auVar159 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,4);
              auVar12 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
              auVar22 = vpand_avx(auVar22,auVar12);
              auVar159 = vpmovsxwd_avx2(auVar22);
              auVar191 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                            CONCAT816(local_4c0[1]._16_8_,
                                                      CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_
                                                              ))));
              if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar159 >> 0x7f,0) != '\0') ||
                    (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar159 >> 0xbf,0) != '\0') ||
                  (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar159[0x1f] < '\0') {
                auVar126 = ZEXT1632(CONCAT412(fVar181 * auVar13._12_4_,
                                              CONCAT48(fVar180 * auVar13._8_4_,
                                                       CONCAT44(fVar179 * auVar13._4_4_,
                                                                fVar144 * auVar13._0_4_))));
                auVar87._28_4_ = SUB84(local_4c0[1]._24_8_,4);
                auVar87._0_28_ =
                     ZEXT1628(CONCAT412(fVar181 * auVar14._12_4_,
                                        CONCAT48(fVar180 * auVar14._8_4_,
                                                 CONCAT44(fVar179 * auVar14._4_4_,
                                                          fVar144 * auVar14._0_4_))));
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = &DAT_3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar200._16_4_ = 0x3f800000;
                auVar200._20_4_ = 0x3f800000;
                auVar200._24_4_ = 0x3f800000;
                auVar200._28_4_ = 0x3f800000;
                auVar25 = vsubps_avx(auVar200,auVar126);
                local_120 = vblendvps_avx(auVar25,auVar126,auVar27);
                auVar25 = vsubps_avx(auVar200,auVar87);
                local_2a0 = vblendvps_avx(auVar25,auVar87,auVar27);
                auVar161 = ZEXT3264(local_2a0);
                auVar191 = ZEXT3264(auVar159);
                local_420 = auVar178;
              }
            }
            auVar223 = ZEXT3264(local_6e0);
            auVar211 = ZEXT3264(local_6c0);
            auVar208 = ZEXT3264(local_6a0);
            auVar205 = ZEXT3264(local_720);
            auVar159 = auVar191._0_32_;
            auVar23 = _local_780;
            if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0x7f,0) == '\0') &&
                  (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar159 >> 0xbf,0) == '\0') &&
                (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar191[0x1f]) goto LAB_018ce0e3;
            auVar25 = vsubps_avx(local_680._0_32_,local_7c0);
            auVar22 = vfmadd213ps_fma(auVar25,local_120,local_7c0);
            fVar145 = pre->depth_scale;
            auVar88._4_4_ = (auVar22._4_4_ + auVar22._4_4_) * fVar145;
            auVar88._0_4_ = (auVar22._0_4_ + auVar22._0_4_) * fVar145;
            auVar88._8_4_ = (auVar22._8_4_ + auVar22._8_4_) * fVar145;
            auVar88._12_4_ = (auVar22._12_4_ + auVar22._12_4_) * fVar145;
            auVar88._16_4_ = fVar145 * 0.0;
            auVar88._20_4_ = fVar145 * 0.0;
            auVar88._24_4_ = fVar145 * 0.0;
            auVar88._28_4_ = fVar145;
            auVar25 = vcmpps_avx(local_420,auVar88,6);
            auVar178 = auVar159 & auVar25;
            auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                          CONCAT424(fStack_5e8,
                                                    CONCAT420(fStack_5ec,
                                                              CONCAT416(fStack_5f0,
                                                                        CONCAT412(fStack_5f4,
                                                                                  CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            auVar201 = ZEXT3264(local_620);
            auVar191 = ZEXT3264(local_5e0);
            if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar178 >> 0x7f,0) != '\0') ||
                  (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0xbf,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar178[0x1f] < '\0') {
              auVar159 = vandps_avx(auVar25,auVar159);
              auVar139._8_4_ = 0xbf800000;
              auVar139._0_8_ = 0xbf800000bf800000;
              auVar139._12_4_ = 0xbf800000;
              auVar139._16_4_ = 0xbf800000;
              auVar139._20_4_ = 0xbf800000;
              auVar139._24_4_ = 0xbf800000;
              auVar139._28_4_ = 0xbf800000;
              auVar160._8_4_ = 0x40000000;
              auVar160._0_8_ = 0x4000000040000000;
              auVar160._12_4_ = 0x40000000;
              auVar160._16_4_ = 0x40000000;
              auVar160._20_4_ = 0x40000000;
              auVar160._24_4_ = 0x40000000;
              auVar160._28_4_ = 0x40000000;
              auVar161 = ZEXT3264(auVar160);
              auVar22 = vfmadd213ps_fma(local_2a0,auVar160,auVar139);
              local_3e0 = local_120;
              local_2a0 = ZEXT1632(auVar22);
              auVar25 = local_2a0;
              local_3c0 = ZEXT1632(auVar22);
              local_3a0 = local_420;
              local_37c = iVar20;
              local_370 = local_760;
              uStack_368 = uStack_758;
              local_360 = local_630;
              uStack_358 = uStack_628;
              local_350 = local_640;
              uStack_348 = uStack_638;
              local_340 = CONCAT44(fStack_64c,local_650);
              uStack_338 = CONCAT44(fStack_644,fStack_648);
              local_320 = auVar159;
              pGVar113 = (context->scene->geometries).items[local_7e8].ptr;
              if ((pGVar113->mask & (ray->super_RayK<1>).mask) != 0) {
                local_4c0[0] = auVar159;
                fVar145 = (float)local_380;
                local_300[0] = (fVar145 + local_120._0_4_ + 0.0) * local_180;
                local_300[1] = (fVar145 + local_120._4_4_ + 1.0) * fStack_17c;
                local_300[2] = (fVar145 + local_120._8_4_ + 2.0) * fStack_178;
                local_300[3] = (fVar145 + local_120._12_4_ + 3.0) * fStack_174;
                fStack_2f0 = (fVar145 + local_120._16_4_ + 4.0) * fStack_170;
                fStack_2ec = (fVar145 + local_120._20_4_ + 5.0) * fStack_16c;
                fStack_2e8 = (fVar145 + local_120._24_4_ + 6.0) * fStack_168;
                fStack_2e4 = fVar145 + local_120._28_4_ + 7.0;
                local_2a0._0_8_ = auVar22._0_8_;
                local_2a0._8_8_ = auVar22._8_8_;
                local_2e0 = local_2a0._0_8_;
                uStack_2d8 = local_2a0._8_8_;
                uStack_2d0 = 0;
                uStack_2c8 = 0;
                local_2c0 = local_420;
                auVar140._8_4_ = 0x7f800000;
                auVar140._0_8_ = 0x7f8000007f800000;
                auVar140._12_4_ = 0x7f800000;
                auVar140._16_4_ = 0x7f800000;
                auVar140._20_4_ = 0x7f800000;
                auVar140._24_4_ = 0x7f800000;
                auVar140._28_4_ = 0x7f800000;
                auVar178 = vblendvps_avx(auVar140,local_420,auVar159);
                auVar126 = vshufps_avx(auVar178,auVar178,0xb1);
                auVar126 = vminps_avx(auVar178,auVar126);
                auVar136 = vshufpd_avx(auVar126,auVar126,5);
                auVar126 = vminps_avx(auVar126,auVar136);
                auVar136 = vpermpd_avx2(auVar126,0x4e);
                auVar126 = vminps_avx(auVar126,auVar136);
                auVar178 = vcmpps_avx(auVar178,auVar126,0);
                auVar126 = auVar159 & auVar178;
                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0x7f,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar126[0x1f] < '\0') {
                  auVar159 = vandps_avx(auVar178,auVar159);
                }
                uVar109 = vmovmskps_avx(auVar159);
                uVar107 = 0;
                for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                  uVar107 = uVar107 + 1;
                }
                uVar110 = (ulong)uVar107;
                local_2a0 = auVar25;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar113->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar145 = local_300[uVar110];
                  fVar144 = *(float *)((long)&local_2e0 + uVar110 * 4);
                  fVar180 = 1.0 - fVar145;
                  fVar179 = fVar180 * fVar180 * -3.0;
                  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar180)),
                                            ZEXT416((uint)(fVar145 * fVar180)),ZEXT416(0xc0000000));
                  auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar145 * fVar180)),
                                            ZEXT416((uint)(fVar145 * fVar145)),ZEXT416(0x40000000));
                  fVar180 = auVar22._0_4_ * 3.0;
                  fVar181 = auVar11._0_4_ * 3.0;
                  fVar182 = fVar145 * fVar145 * 3.0;
                  auVar170._0_4_ = fVar182 * local_650;
                  auVar170._4_4_ = fVar182 * fStack_64c;
                  auVar170._8_4_ = fVar182 * fStack_648;
                  auVar170._12_4_ = fVar182 * fStack_644;
                  auVar148._4_4_ = fVar181;
                  auVar148._0_4_ = fVar181;
                  auVar148._8_4_ = fVar181;
                  auVar148._12_4_ = fVar181;
                  auVar102._8_8_ = uStack_638;
                  auVar102._0_8_ = local_640;
                  auVar22 = vfmadd132ps_fma(auVar148,auVar170,auVar102);
                  auVar163._4_4_ = fVar180;
                  auVar163._0_4_ = fVar180;
                  auVar163._8_4_ = fVar180;
                  auVar163._12_4_ = fVar180;
                  auVar103._8_8_ = uStack_628;
                  auVar103._0_8_ = local_630;
                  auVar22 = vfmadd132ps_fma(auVar163,auVar22,auVar103);
                  auVar149._4_4_ = fVar179;
                  auVar149._0_4_ = fVar179;
                  auVar149._8_4_ = fVar179;
                  auVar149._12_4_ = fVar179;
                  auVar99._8_8_ = uStack_758;
                  auVar99._0_8_ = local_760;
                  auVar22 = vfmadd132ps_fma(auVar149,auVar22,auVar99);
                  auVar161 = ZEXT1664(auVar22);
                  (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar110 * 4);
                  uVar116 = vmovlps_avx(auVar22);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar116;
                  fVar179 = (float)vextractps_avx(auVar22,2);
                  (ray->Ng).field_0.field_0.z = fVar179;
                  ray->u = fVar145;
                  ray->v = fVar144;
                  ray->primID = (uint)local_788;
                  ray->geomID = (uint)local_7e8;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_7e0._8_8_ = uStack_628;
                  local_7e0._0_8_ = local_630;
                  local_680._0_16_ = CONCAT88(uStack_638,local_640);
                  local_680._0_32_ = ZEXT1632(local_680._0_16_);
                  uStack_558 = CONCAT44(fStack_644,fStack_648);
                  local_560 = (undefined1  [8])CONCAT44(fStack_64c,local_650);
                  local_580 = ZEXT1632(CONCAT88(auVar11._8_8_,pGVar113));
                  local_7f0 = prim;
                  local_7f8 = context;
                  local_800 = pre;
                  do {
                    local_5a4 = local_300[uVar110];
                    local_5a0 = *(undefined4 *)((long)&local_2e0 + uVar110 * 4);
                    local_780._0_4_ = (ray->super_RayK<1>).tfar;
                    local_7c0._0_8_ = uVar110;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar110 * 4);
                    local_750.context = context->user;
                    fVar144 = 1.0 - local_5a4;
                    fVar145 = fVar144 * fVar144 * -3.0;
                    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),
                                              ZEXT416((uint)(local_5a4 * fVar144)),
                                              ZEXT416(0xc0000000));
                    auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar144)),
                                              ZEXT416((uint)(local_5a4 * local_5a4)),
                                              ZEXT416(0x40000000));
                    fVar144 = auVar22._0_4_ * 3.0;
                    fVar179 = auVar11._0_4_ * 3.0;
                    fVar180 = local_5a4 * local_5a4 * 3.0;
                    auVar171._0_4_ = fVar180 * (float)local_560._0_4_;
                    auVar171._4_4_ = fVar180 * (float)local_560._4_4_;
                    auVar171._8_4_ = fVar180 * (float)uStack_558;
                    auVar171._12_4_ = fVar180 * uStack_558._4_4_;
                    auVar150._4_4_ = fVar179;
                    auVar150._0_4_ = fVar179;
                    auVar150._8_4_ = fVar179;
                    auVar150._12_4_ = fVar179;
                    auVar22 = vfmadd132ps_fma(auVar150,auVar171,local_680._0_16_);
                    auVar164._4_4_ = fVar144;
                    auVar164._0_4_ = fVar144;
                    auVar164._8_4_ = fVar144;
                    auVar164._12_4_ = fVar144;
                    auVar22 = vfmadd132ps_fma(auVar164,auVar22,local_7e0._0_16_);
                    auVar151._4_4_ = fVar145;
                    auVar151._0_4_ = fVar145;
                    auVar151._8_4_ = fVar145;
                    auVar151._12_4_ = fVar145;
                    auVar100._8_8_ = uStack_758;
                    auVar100._0_8_ = local_760;
                    auVar22 = vfmadd132ps_fma(auVar151,auVar22,auVar100);
                    local_5b0 = vmovlps_avx(auVar22);
                    local_5a8 = vextractps_avx(auVar22,2);
                    local_59c = (int)local_788;
                    local_598 = (int)local_7e8;
                    local_594 = (local_750.context)->instID[0];
                    local_590 = (local_750.context)->instPrimID[0];
                    local_804 = -1;
                    local_750.valid = &local_804;
                    local_750.geometryUserPtr = pGVar113->userPtr;
                    local_750.ray = (RTCRayN *)ray;
                    local_750.hit = (RTCHitN *)&local_5b0;
                    local_750.N = 1;
                    if (pGVar113->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018ce64f:
                      p_Var21 = context->args->filter;
                      if (p_Var21 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar113->field_8).field_0x2 & 0x40) != 0)) {
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          (*p_Var21)(&local_750);
                          pGVar113 = (Geometry *)local_580._0_8_;
                        }
                        auVar208 = ZEXT3264(local_6a0);
                        auVar205 = ZEXT3264(local_720);
                        auVar211 = ZEXT3264(local_6c0);
                        auVar223 = ZEXT3264(local_6e0);
                        auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                                      CONCAT424(fStack_5e8,
                                                                CONCAT420(fStack_5ec,
                                                                          CONCAT416(fStack_5f0,
                                                                                    CONCAT412(
                                                  fStack_5f4,
                                                  CONCAT48(fStack_5f8,CONCAT44(fStack_5fc,local_600)
                                                          )))))));
                        auVar201 = ZEXT3264(local_620);
                        prim = local_7f0;
                        context = local_7f8;
                        pre = local_800;
                        fVar229 = (float)local_700;
                        fVar232 = local_700._4_4_;
                        fVar131 = (float)uStack_6f8;
                        fVar233 = uStack_6f8._4_4_;
                        fVar234 = (float)uStack_6f0;
                        fVar235 = uStack_6f0._4_4_;
                        fVar236 = (float)uStack_6e8;
                        if (*local_750.valid == 0) goto LAB_018ce745;
                      }
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                           *(float *)local_750.hit;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_750.hit + 4);
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_750.hit + 8);
                      *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                      *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                      *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                      *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                      *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                      *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    }
                    else {
                      auVar216 = ZEXT1664(auVar216._0_16_);
                      (*pGVar113->intersectionFilterN)(&local_750);
                      auVar201 = ZEXT3264(local_620);
                      auVar197 = ZEXT3264(CONCAT428(fStack_5e4,
                                                    CONCAT424(fStack_5e8,
                                                              CONCAT420(fStack_5ec,
                                                                        CONCAT416(fStack_5f0,
                                                                                  CONCAT412(
                                                  fStack_5f4,
                                                  CONCAT48(fStack_5f8,CONCAT44(fStack_5fc,local_600)
                                                          )))))));
                      auVar223 = ZEXT3264(local_6e0);
                      auVar211 = ZEXT3264(local_6c0);
                      auVar205 = ZEXT3264(local_720);
                      auVar208 = ZEXT3264(local_6a0);
                      pGVar113 = (Geometry *)local_580._0_8_;
                      prim = local_7f0;
                      context = local_7f8;
                      pre = local_800;
                      fVar229 = (float)local_700;
                      fVar232 = local_700._4_4_;
                      fVar131 = (float)uStack_6f8;
                      fVar233 = uStack_6f8._4_4_;
                      fVar234 = (float)uStack_6f0;
                      fVar235 = uStack_6f0._4_4_;
                      fVar236 = (float)uStack_6e8;
                      if (*local_750.valid != 0) goto LAB_018ce64f;
LAB_018ce745:
                      (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                      prim = local_7f0;
                      context = local_7f8;
                      pre = local_800;
                    }
                    auVar126 = local_420;
                    *(undefined4 *)(local_4c0[0] + local_7c0._0_8_ * 4) = 0;
                    auVar178 = local_4c0[0];
                    fVar145 = (ray->super_RayK<1>).tfar;
                    auVar129._4_4_ = fVar145;
                    auVar129._0_4_ = fVar145;
                    auVar129._8_4_ = fVar145;
                    auVar129._12_4_ = fVar145;
                    auVar129._16_4_ = fVar145;
                    auVar129._20_4_ = fVar145;
                    auVar129._24_4_ = fVar145;
                    auVar129._28_4_ = fVar145;
                    auVar25 = vcmpps_avx(auVar126,auVar129,2);
                    auVar159 = vandps_avx(auVar25,local_4c0[0]);
                    local_4c0[0] = auVar159;
                    auVar25 = auVar178 & auVar25;
                    bVar95 = (auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar96 = (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar94 = (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar93 = SUB321(auVar25 >> 0x7f,0) != '\0';
                    bVar92 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar91 = SUB321(auVar25 >> 0xbf,0) != '\0';
                    bVar90 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar89 = auVar25[0x1f] < '\0';
                    uVar110 = local_7c0._0_8_;
                    if (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) ||
                        bVar90) || bVar89) {
                      auVar141._8_4_ = 0x7f800000;
                      auVar141._0_8_ = 0x7f8000007f800000;
                      auVar141._12_4_ = 0x7f800000;
                      auVar141._16_4_ = 0x7f800000;
                      auVar141._20_4_ = 0x7f800000;
                      auVar141._24_4_ = 0x7f800000;
                      auVar141._28_4_ = 0x7f800000;
                      auVar25 = vblendvps_avx(auVar141,auVar126,auVar159);
                      auVar178 = vshufps_avx(auVar25,auVar25,0xb1);
                      auVar178 = vminps_avx(auVar25,auVar178);
                      auVar126 = vshufpd_avx(auVar178,auVar178,5);
                      auVar178 = vminps_avx(auVar178,auVar126);
                      auVar126 = vpermpd_avx2(auVar178,0x4e);
                      auVar178 = vminps_avx(auVar178,auVar126);
                      auVar25 = vcmpps_avx(auVar25,auVar178,0);
                      auVar126 = auVar159 & auVar25;
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') {
                        auVar159 = vandps_avx(auVar25,auVar159);
                      }
                      uVar109 = vmovmskps_avx(auVar159);
                      uVar107 = 0;
                      for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x80000000) {
                        uVar107 = uVar107 + 1;
                      }
                      uVar110 = (ulong)uVar107;
                    }
                    auVar161 = ZEXT3264(auVar178);
                  } while (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) ||
                           bVar90) || bVar89);
                }
                auVar191 = ZEXT3264(local_5e0);
              }
            }
          }
          auVar143 = ZEXT3264(local_540);
          lVar111 = lVar111 + 8;
        } while ((int)lVar111 < iVar20);
      }
      fVar145 = (ray->super_RayK<1>).tfar;
      auVar127._4_4_ = fVar145;
      auVar127._0_4_ = fVar145;
      auVar127._8_4_ = fVar145;
      auVar127._12_4_ = fVar145;
      auVar127._16_4_ = fVar145;
      auVar127._20_4_ = fVar145;
      auVar127._24_4_ = fVar145;
      auVar127._28_4_ = fVar145;
      auVar159 = vcmpps_avx(local_80,auVar127,2);
      uVar107 = vmovmskps_avx(auVar159);
      uVar107 = (uint)uVar114 & uVar107;
    } while (uVar107 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }